

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O3

void __thiscall slang::ast::Compilation::Compilation(Compilation *this,Bag *options)

{
  flat_hash_map<syntax::SyntaxKind,_const_Type_*> *this_00;
  _Head_base<0UL,_slang::ast::NetType_*,_false> _Var1;
  RootSymbol *pRVar2;
  undefined8 uVar3;
  bitmask<slang::ast::IntegralFlags> bVar4;
  sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::ast::Definition_*,_bool>_>_>
  *psVar5;
  sherwood_v3_entry<std::pair<unsigned_int,_const_slang::ast::Type_*>_> *psVar6;
  sherwood_v3_entry<std::pair<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_> *psVar7;
  sherwood_v3_entry<std::pair<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>_>_>
  *psVar8;
  sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>_>
  *psVar9;
  sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SystemSubroutine_*>_>
  *psVar10;
  sherwood_v3_entry<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_const_slang::ast::SystemSubroutine_*>_>
  *psVar11;
  sherwood_v3_entry<std::pair<const_void_*,_nonstd::span_lite::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>_>
  *psVar12;
  sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_> *psVar13;
  sherwood_v3_entry<std::pair<const_slang::syntax::ModuleDeclarationSyntax_*,_slang::ast::Compilation::DefinitionMetadata>_>
  *psVar14;
  sherwood_v3_entry<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>_>
  *psVar15;
  sherwood_v3_entry<std::pair<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>_>
  *psVar16;
  sherwood_v3_entry<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>_>_>
  *psVar17;
  sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PrimitiveSymbol_*>_>
  *psVar18;
  sherwood_v3_entry<std::pair<const_slang::ast::Definition_*,_std::vector<const_slang::syntax::BindDirectiveSyntax_*,_std::allocator<const_slang::syntax::BindDirectiveSyntax_*>_>_>_>
  *psVar19;
  sherwood_v3_entry<const_slang::syntax::BindDirectiveSyntax_*> *psVar20;
  sherwood_v3_entry<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ConstantValue>_>
  *psVar21;
  sherwood_v3_entry<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>_>
  *psVar22;
  sherwood_v3_entry<std::pair<const_slang::ast::PackageSymbol_*,_ska::flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>_>_>
  *psVar23;
  sherwood_v3_entry<std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>_> *psVar24;
  sherwood_v3_entry<std::pair<const_slang::ast::Scope_*,_const_slang::ast::Expression_*>_> *psVar25;
  ScalarType *pSVar26;
  PredefinedIntegerType *pPVar27;
  FloatingType *pFVar28;
  Type *pTVar29;
  PredefinedIntegerType *pPVar30;
  PredefinedIntegerType *pPVar31;
  NetType *pNVar32;
  RootSymbol *thisSym_;
  PackageSymbol *pPVar33;
  TypeArgFormatter *this_01;
  pair<ska::detailv3::sherwood_v3_table<std::pair<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::syntax::SyntaxKind,_slang::Hasher<slang::syntax::SyntaxKind>,_ska::detailv3::KeyOrValueHasher<slang::syntax::SyntaxKind,_std::pair<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::Hasher<slang::syntax::SyntaxKind>_>,_std::equal_to<slang::syntax::SyntaxKind>,_ska::detailv3::KeyOrValueEquality<slang::syntax::SyntaxKind,_std::pair<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_std::equal_to<slang::syntax::SyntaxKind>_>,_std::allocator<std::pair<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>_>::templated_iterator<std::pair<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>,_bool>
  pVar34;
  string_view sVar35;
  pair<ska::detailv3::sherwood_v3_table<std::pair<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>_>,_slang::parsing::TokenKind,_slang::Hasher<slang::parsing::TokenKind>,_ska::detailv3::KeyOrValueHasher<slang::parsing::TokenKind,_std::pair<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>_>,_slang::Hasher<slang::parsing::TokenKind>_>,_std::equal_to<slang::parsing::TokenKind>,_ska::detailv3::KeyOrValueEquality<slang::parsing::TokenKind,_std::pair<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>_>,_std::equal_to<slang::parsing::TokenKind>_>,_std::allocator<std::pair<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>_>_>_>_>::templated_iterator<std::pair<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>_>_>,_bool>
  pVar36;
  convertible_to_value local_119;
  ScalarType *local_118;
  sherwood_v3_table<std::pair<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,slang::parsing::TokenKind,slang::Hasher<slang::parsing::TokenKind>,ska::detailv3::KeyOrValueHasher<slang::parsing::TokenKind,std::pair<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,slang::Hasher<slang::parsing::TokenKind>>,std::equal_to<slang::parsing::TokenKind>,ska::detailv3::KeyOrValueEquality<slang::parsing::TokenKind,std::pair<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,std::equal_to<slang::parsing::TokenKind>>,std::allocator<std::pair<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>>
  *local_110;
  _Head_base<0UL,_slang::ast::TypeArgFormatter_*,_false> local_108 [5];
  ScalarType *local_e0;
  TypedBumpAllocator<slang::ast::GenericClassDefSymbol> *local_d8;
  sherwood_v3_table<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PackageSymbol_const*>,std::basic_string_view<char,std::char_traits<char>>,slang::Hasher<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PackageSymbol_const*>,slang::Hasher<std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PackageSymbol_const*>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PackageSymbol_const*>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PackageSymbol_const*>>>>
  *local_d0;
  ScalarType *local_c8;
  ScalarType *local_c0;
  ParamOverrideNode *local_b8;
  Diagnostic *local_b0;
  TypedBumpAllocator<ska::flat_hash_map<unsigned_long,_unsigned_long,_slang::Hasher<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
  *local_a8;
  TypedBumpAllocator<ska::flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>_>
  *local_a0;
  TypedBumpAllocator<slang::ConstantValue> *local_98;
  SafeIndexedVector<slang::ast::Scope::DeferredMemberData,_slang::ast::Scope::DeferredMemberIndex>
  *local_90;
  SafeIndexedVector<std::vector<const_slang::ast::WildcardImportSymbol_*,_std::allocator<const_slang::ast::WildcardImportSymbol_*>_>,_slang::ast::Scope::ImportDataIndex>
  *local_88;
  Type *local_80;
  Type *local_78;
  Type *local_70;
  Type *local_68;
  Type *local_60;
  Type *local_58;
  Type *local_50;
  Type *local_48;
  shared_ptr<slang::DiagArgFormatter> local_40;
  
  BumpAllocator::BumpAllocator(&this->super_BumpAllocator);
  Bag::getOrDefault<slang::ast::CompilationOptions>(&this->options,options);
  BumpAllocator::BumpAllocator(&(this->symbolMapAllocator).super_BumpAllocator);
  BumpAllocator::BumpAllocator(&(this->pointerMapAllocator).super_BumpAllocator);
  BumpAllocator::BumpAllocator(&(this->constantAllocator).super_BumpAllocator);
  BumpAllocator::BumpAllocator(&(this->genericClassAllocator).super_BumpAllocator);
  this->scalarTypeTable[6] = (Type *)0x0;
  this->scalarTypeTable[7] = (Type *)0x0;
  this->scalarTypeTable[4] = (Type *)0x0;
  this->scalarTypeTable[5] = (Type *)0x0;
  this->scalarTypeTable[2] = (Type *)0x0;
  this->scalarTypeTable[3] = (Type *)0x0;
  this->scalarTypeTable[0] = (Type *)0x0;
  this->scalarTypeTable[1] = (Type *)0x0;
  SafeIndexedVector<slang::ast::Scope::DeferredMemberData,_slang::ast::Scope::DeferredMemberIndex>::
  SafeIndexedVector(&this->deferredData);
  local_88 = &this->importData;
  SafeIndexedVector<std::vector<const_slang::ast::WildcardImportSymbol_*,_std::allocator<const_slang::ast::WildcardImportSymbol_*>_>,_slang::ast::Scope::ImportDataIndex>
  ::SafeIndexedVector(local_88);
  psVar5 = ska::detailv3::
           empty_default_table<std::pair<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::ast::Definition_const*,bool>>>
                     ();
  (this->topDefinitions).
  super_sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::ast::Definition_*,_bool>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::ast::Definition_*,_bool>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::ast::Definition_*,_bool>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::ast::Definition_*,_bool>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::ast::Definition_*,_bool>_>_>_>_>
  .entries = psVar5;
  (this->topDefinitions).
  super_sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::ast::Definition_*,_bool>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::ast::Definition_*,_bool>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::ast::Definition_*,_bool>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::ast::Definition_*,_bool>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::ast::Definition_*,_bool>_>_>_>_>
  .num_slots_minus_one = 0;
  (this->topDefinitions).
  super_sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::ast::Definition_*,_bool>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::ast::Definition_*,_bool>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::ast::Definition_*,_bool>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::ast::Definition_*,_bool>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::ast::Definition_*,_bool>_>_>_>_>
  .hash_policy = '?';
  (this->topDefinitions).
  super_sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::ast::Definition_*,_bool>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::ast::Definition_*,_bool>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::ast::Definition_*,_bool>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::ast::Definition_*,_bool>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::ast::Definition_*,_bool>_>_>_>_>
  .max_lookups = '\x03';
  (this->topDefinitions).
  super_sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::ast::Definition_*,_bool>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::ast::Definition_*,_bool>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::ast::Definition_*,_bool>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::ast::Definition_*,_bool>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::ast::Definition_*,_bool>_>_>_>_>
  ._max_load_factor = 0.5;
  (this->topDefinitions).
  super_sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::ast::Definition_*,_bool>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::ast::Definition_*,_bool>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::ast::Definition_*,_bool>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::ast::Definition_*,_bool>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::ast::Definition_*,_bool>_>_>_>_>
  .num_elements = 0;
  psVar6 = ska::detailv3::empty_default_table<std::pair<unsigned_int,slang::ast::Type_const*>>();
  (this->vectorTypeCache).
  super_sherwood_v3_table<std::pair<unsigned_int,_const_slang::ast::Type_*>,_unsigned_int,_slang::Hasher<unsigned_int>,_ska::detailv3::KeyOrValueHasher<unsigned_int,_std::pair<unsigned_int,_const_slang::ast::Type_*>,_slang::Hasher<unsigned_int>_>,_std::equal_to<unsigned_int>,_ska::detailv3::KeyOrValueEquality<unsigned_int,_std::pair<unsigned_int,_const_slang::ast::Type_*>,_std::equal_to<unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_const_slang::ast::Type_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<unsigned_int,_const_slang::ast::Type_*>_>_>_>
  .entries = psVar6;
  (this->vectorTypeCache).
  super_sherwood_v3_table<std::pair<unsigned_int,_const_slang::ast::Type_*>,_unsigned_int,_slang::Hasher<unsigned_int>,_ska::detailv3::KeyOrValueHasher<unsigned_int,_std::pair<unsigned_int,_const_slang::ast::Type_*>,_slang::Hasher<unsigned_int>_>,_std::equal_to<unsigned_int>,_ska::detailv3::KeyOrValueEquality<unsigned_int,_std::pair<unsigned_int,_const_slang::ast::Type_*>,_std::equal_to<unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_const_slang::ast::Type_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<unsigned_int,_const_slang::ast::Type_*>_>_>_>
  .num_slots_minus_one = 0;
  (this->vectorTypeCache).
  super_sherwood_v3_table<std::pair<unsigned_int,_const_slang::ast::Type_*>,_unsigned_int,_slang::Hasher<unsigned_int>,_ska::detailv3::KeyOrValueHasher<unsigned_int,_std::pair<unsigned_int,_const_slang::ast::Type_*>,_slang::Hasher<unsigned_int>_>,_std::equal_to<unsigned_int>,_ska::detailv3::KeyOrValueEquality<unsigned_int,_std::pair<unsigned_int,_const_slang::ast::Type_*>,_std::equal_to<unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_const_slang::ast::Type_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<unsigned_int,_const_slang::ast::Type_*>_>_>_>
  .hash_policy = '?';
  (this->vectorTypeCache).
  super_sherwood_v3_table<std::pair<unsigned_int,_const_slang::ast::Type_*>,_unsigned_int,_slang::Hasher<unsigned_int>,_ska::detailv3::KeyOrValueHasher<unsigned_int,_std::pair<unsigned_int,_const_slang::ast::Type_*>,_slang::Hasher<unsigned_int>_>,_std::equal_to<unsigned_int>,_ska::detailv3::KeyOrValueEquality<unsigned_int,_std::pair<unsigned_int,_const_slang::ast::Type_*>,_std::equal_to<unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_const_slang::ast::Type_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<unsigned_int,_const_slang::ast::Type_*>_>_>_>
  .max_lookups = '\x03';
  (this->vectorTypeCache).
  super_sherwood_v3_table<std::pair<unsigned_int,_const_slang::ast::Type_*>,_unsigned_int,_slang::Hasher<unsigned_int>,_ska::detailv3::KeyOrValueHasher<unsigned_int,_std::pair<unsigned_int,_const_slang::ast::Type_*>,_slang::Hasher<unsigned_int>_>,_std::equal_to<unsigned_int>,_ska::detailv3::KeyOrValueEquality<unsigned_int,_std::pair<unsigned_int,_const_slang::ast::Type_*>,_std::equal_to<unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_const_slang::ast::Type_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<unsigned_int,_const_slang::ast::Type_*>_>_>_>
  ._max_load_factor = 0.5;
  (this->vectorTypeCache).
  super_sherwood_v3_table<std::pair<unsigned_int,_const_slang::ast::Type_*>,_unsigned_int,_slang::Hasher<unsigned_int>,_ska::detailv3::KeyOrValueHasher<unsigned_int,_std::pair<unsigned_int,_const_slang::ast::Type_*>,_slang::Hasher<unsigned_int>_>,_std::equal_to<unsigned_int>,_ska::detailv3::KeyOrValueEquality<unsigned_int,_std::pair<unsigned_int,_const_slang::ast::Type_*>,_std::equal_to<unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_const_slang::ast::Type_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<unsigned_int,_const_slang::ast::Type_*>_>_>_>
  .num_elements = 0;
  local_90 = &this->deferredData;
  psVar7 = ska::detailv3::
           empty_default_table<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>>();
  this_00 = &this->knownTypes;
  (this->knownTypes).
  super_sherwood_v3_table<std::pair<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::syntax::SyntaxKind,_slang::Hasher<slang::syntax::SyntaxKind>,_ska::detailv3::KeyOrValueHasher<slang::syntax::SyntaxKind,_std::pair<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::Hasher<slang::syntax::SyntaxKind>_>,_std::equal_to<slang::syntax::SyntaxKind>,_ska::detailv3::KeyOrValueEquality<slang::syntax::SyntaxKind,_std::pair<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_std::equal_to<slang::syntax::SyntaxKind>_>,_std::allocator<std::pair<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>_>
  .entries = psVar7;
  (this->knownTypes).
  super_sherwood_v3_table<std::pair<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::syntax::SyntaxKind,_slang::Hasher<slang::syntax::SyntaxKind>,_ska::detailv3::KeyOrValueHasher<slang::syntax::SyntaxKind,_std::pair<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::Hasher<slang::syntax::SyntaxKind>_>,_std::equal_to<slang::syntax::SyntaxKind>,_ska::detailv3::KeyOrValueEquality<slang::syntax::SyntaxKind,_std::pair<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_std::equal_to<slang::syntax::SyntaxKind>_>,_std::allocator<std::pair<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>_>
  .num_slots_minus_one = 0;
  (this->knownTypes).
  super_sherwood_v3_table<std::pair<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::syntax::SyntaxKind,_slang::Hasher<slang::syntax::SyntaxKind>,_ska::detailv3::KeyOrValueHasher<slang::syntax::SyntaxKind,_std::pair<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::Hasher<slang::syntax::SyntaxKind>_>,_std::equal_to<slang::syntax::SyntaxKind>,_ska::detailv3::KeyOrValueEquality<slang::syntax::SyntaxKind,_std::pair<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_std::equal_to<slang::syntax::SyntaxKind>_>,_std::allocator<std::pair<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>_>
  .hash_policy = '?';
  (this->knownTypes).
  super_sherwood_v3_table<std::pair<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::syntax::SyntaxKind,_slang::Hasher<slang::syntax::SyntaxKind>,_ska::detailv3::KeyOrValueHasher<slang::syntax::SyntaxKind,_std::pair<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::Hasher<slang::syntax::SyntaxKind>_>,_std::equal_to<slang::syntax::SyntaxKind>,_ska::detailv3::KeyOrValueEquality<slang::syntax::SyntaxKind,_std::pair<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_std::equal_to<slang::syntax::SyntaxKind>_>,_std::allocator<std::pair<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>_>
  .max_lookups = '\x03';
  (this->knownTypes).
  super_sherwood_v3_table<std::pair<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::syntax::SyntaxKind,_slang::Hasher<slang::syntax::SyntaxKind>,_ska::detailv3::KeyOrValueHasher<slang::syntax::SyntaxKind,_std::pair<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::Hasher<slang::syntax::SyntaxKind>_>,_std::equal_to<slang::syntax::SyntaxKind>,_ska::detailv3::KeyOrValueEquality<slang::syntax::SyntaxKind,_std::pair<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_std::equal_to<slang::syntax::SyntaxKind>_>,_std::allocator<std::pair<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>_>
  ._max_load_factor = 0.5;
  (this->knownTypes).
  super_sherwood_v3_table<std::pair<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::syntax::SyntaxKind,_slang::Hasher<slang::syntax::SyntaxKind>,_ska::detailv3::KeyOrValueHasher<slang::syntax::SyntaxKind,_std::pair<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::Hasher<slang::syntax::SyntaxKind>_>,_std::equal_to<slang::syntax::SyntaxKind>,_ska::detailv3::KeyOrValueEquality<slang::syntax::SyntaxKind,_std::pair<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_std::equal_to<slang::syntax::SyntaxKind>_>,_std::allocator<std::pair<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>_>
  .num_elements = 0;
  psVar8 = ska::detailv3::
           empty_default_table<std::pair<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>
                     ();
  local_110 = (sherwood_v3_table<std::pair<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,slang::parsing::TokenKind,slang::Hasher<slang::parsing::TokenKind>,ska::detailv3::KeyOrValueHasher<slang::parsing::TokenKind,std::pair<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,slang::Hasher<slang::parsing::TokenKind>>,std::equal_to<slang::parsing::TokenKind>,ska::detailv3::KeyOrValueEquality<slang::parsing::TokenKind,std::pair<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,std::equal_to<slang::parsing::TokenKind>>,std::allocator<std::pair<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>>
               *)&this->knownNetTypes;
  (this->knownNetTypes).
  super_sherwood_v3_table<std::pair<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>_>,_slang::parsing::TokenKind,_slang::Hasher<slang::parsing::TokenKind>,_ska::detailv3::KeyOrValueHasher<slang::parsing::TokenKind,_std::pair<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>_>,_slang::Hasher<slang::parsing::TokenKind>_>,_std::equal_to<slang::parsing::TokenKind>,_ska::detailv3::KeyOrValueEquality<slang::parsing::TokenKind,_std::pair<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>_>,_std::equal_to<slang::parsing::TokenKind>_>,_std::allocator<std::pair<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>_>_>_>_>
  .entries = psVar8;
  (this->knownNetTypes).
  super_sherwood_v3_table<std::pair<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>_>,_slang::parsing::TokenKind,_slang::Hasher<slang::parsing::TokenKind>,_ska::detailv3::KeyOrValueHasher<slang::parsing::TokenKind,_std::pair<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>_>,_slang::Hasher<slang::parsing::TokenKind>_>,_std::equal_to<slang::parsing::TokenKind>,_ska::detailv3::KeyOrValueEquality<slang::parsing::TokenKind,_std::pair<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>_>,_std::equal_to<slang::parsing::TokenKind>_>,_std::allocator<std::pair<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>_>_>_>_>
  .num_slots_minus_one = 0;
  (this->knownNetTypes).
  super_sherwood_v3_table<std::pair<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>_>,_slang::parsing::TokenKind,_slang::Hasher<slang::parsing::TokenKind>,_ska::detailv3::KeyOrValueHasher<slang::parsing::TokenKind,_std::pair<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>_>,_slang::Hasher<slang::parsing::TokenKind>_>,_std::equal_to<slang::parsing::TokenKind>,_ska::detailv3::KeyOrValueEquality<slang::parsing::TokenKind,_std::pair<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>_>,_std::equal_to<slang::parsing::TokenKind>_>,_std::allocator<std::pair<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>_>_>_>_>
  .hash_policy = '?';
  (this->knownNetTypes).
  super_sherwood_v3_table<std::pair<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>_>,_slang::parsing::TokenKind,_slang::Hasher<slang::parsing::TokenKind>,_ska::detailv3::KeyOrValueHasher<slang::parsing::TokenKind,_std::pair<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>_>,_slang::Hasher<slang::parsing::TokenKind>_>,_std::equal_to<slang::parsing::TokenKind>,_ska::detailv3::KeyOrValueEquality<slang::parsing::TokenKind,_std::pair<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>_>,_std::equal_to<slang::parsing::TokenKind>_>,_std::allocator<std::pair<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>_>_>_>_>
  .max_lookups = '\x03';
  (this->knownNetTypes).
  super_sherwood_v3_table<std::pair<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>_>,_slang::parsing::TokenKind,_slang::Hasher<slang::parsing::TokenKind>,_ska::detailv3::KeyOrValueHasher<slang::parsing::TokenKind,_std::pair<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>_>,_slang::Hasher<slang::parsing::TokenKind>_>,_std::equal_to<slang::parsing::TokenKind>,_ska::detailv3::KeyOrValueEquality<slang::parsing::TokenKind,_std::pair<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>_>,_std::equal_to<slang::parsing::TokenKind>_>,_std::allocator<std::pair<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>_>_>_>_>
  ._max_load_factor = 0.5;
  (this->knownNetTypes).
  super_sherwood_v3_table<std::pair<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>_>,_slang::parsing::TokenKind,_slang::Hasher<slang::parsing::TokenKind>,_ska::detailv3::KeyOrValueHasher<slang::parsing::TokenKind,_std::pair<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>_>,_slang::Hasher<slang::parsing::TokenKind>_>,_std::equal_to<slang::parsing::TokenKind>,_ska::detailv3::KeyOrValueEquality<slang::parsing::TokenKind,_std::pair<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>_>,_std::equal_to<slang::parsing::TokenKind>_>,_std::allocator<std::pair<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>_>_>_>_>
  .num_elements = 0;
  psVar9 = ska::detailv3::
           empty_default_table<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PackageSymbol_const*>>
                     ();
  local_d0 = (sherwood_v3_table<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PackageSymbol_const*>,std::basic_string_view<char,std::char_traits<char>>,slang::Hasher<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PackageSymbol_const*>,slang::Hasher<std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PackageSymbol_const*>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PackageSymbol_const*>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PackageSymbol_const*>>>>
              *)&this->packageMap;
  (this->packageMap).
  super_sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>_>_>_>
  .entries = psVar9;
  (this->packageMap).
  super_sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>_>_>_>
  .num_slots_minus_one = 0;
  (this->packageMap).
  super_sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>_>_>_>
  .hash_policy = '?';
  (this->packageMap).
  super_sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>_>_>_>
  .max_lookups = '\x03';
  (this->packageMap).
  super_sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>_>_>_>
  ._max_load_factor = 0.5;
  (this->packageMap).
  super_sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>_>_>_>
  .num_elements = 0;
  psVar10 = ska::detailv3::
            empty_default_table<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::SystemSubroutine_const*>>
                      ();
  (this->subroutineMap).
  super_sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SystemSubroutine_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SystemSubroutine_*>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SystemSubroutine_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SystemSubroutine_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SystemSubroutine_*>_>_>_>
  .entries = psVar10;
  (this->subroutineMap).
  super_sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SystemSubroutine_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SystemSubroutine_*>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SystemSubroutine_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SystemSubroutine_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SystemSubroutine_*>_>_>_>
  .num_slots_minus_one = 0;
  (this->subroutineMap).
  super_sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SystemSubroutine_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SystemSubroutine_*>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SystemSubroutine_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SystemSubroutine_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SystemSubroutine_*>_>_>_>
  .hash_policy = '?';
  (this->subroutineMap).
  super_sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SystemSubroutine_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SystemSubroutine_*>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SystemSubroutine_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SystemSubroutine_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SystemSubroutine_*>_>_>_>
  .max_lookups = '\x03';
  (this->subroutineMap).
  super_sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SystemSubroutine_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SystemSubroutine_*>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SystemSubroutine_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SystemSubroutine_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SystemSubroutine_*>_>_>_>
  ._max_load_factor = 0.5;
  (this->subroutineMap).
  super_sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SystemSubroutine_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SystemSubroutine_*>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SystemSubroutine_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SystemSubroutine_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SystemSubroutine_*>_>_>_>
  .num_elements = 0;
  psVar11 = ska::detailv3::
            empty_default_table<std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::SymbolKind>,slang::ast::SystemSubroutine_const*>>
                      ();
  (this->methodMap).
  super_sherwood_v3_table<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_const_slang::ast::SystemSubroutine_*>,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_slang::Hasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>_>,_ska::detailv3::KeyOrValueHasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_const_slang::ast::SystemSubroutine_*>,_slang::Hasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>_>_>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>_>,_ska::detailv3::KeyOrValueEquality<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_const_slang::ast::SystemSubroutine_*>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>_>_>,_std::allocator<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_const_slang::ast::SystemSubroutine_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_const_slang::ast::SystemSubroutine_*>_>_>_>
  .entries = psVar11;
  (this->methodMap).
  super_sherwood_v3_table<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_const_slang::ast::SystemSubroutine_*>,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_slang::Hasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>_>,_ska::detailv3::KeyOrValueHasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_const_slang::ast::SystemSubroutine_*>,_slang::Hasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>_>_>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>_>,_ska::detailv3::KeyOrValueEquality<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_const_slang::ast::SystemSubroutine_*>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>_>_>,_std::allocator<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_const_slang::ast::SystemSubroutine_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_const_slang::ast::SystemSubroutine_*>_>_>_>
  .num_slots_minus_one = 0;
  (this->methodMap).
  super_sherwood_v3_table<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_const_slang::ast::SystemSubroutine_*>,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_slang::Hasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>_>,_ska::detailv3::KeyOrValueHasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_const_slang::ast::SystemSubroutine_*>,_slang::Hasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>_>_>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>_>,_ska::detailv3::KeyOrValueEquality<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_const_slang::ast::SystemSubroutine_*>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>_>_>,_std::allocator<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_const_slang::ast::SystemSubroutine_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_const_slang::ast::SystemSubroutine_*>_>_>_>
  .hash_policy = '?';
  (this->methodMap).
  super_sherwood_v3_table<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_const_slang::ast::SystemSubroutine_*>,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_slang::Hasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>_>,_ska::detailv3::KeyOrValueHasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_const_slang::ast::SystemSubroutine_*>,_slang::Hasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>_>_>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>_>,_ska::detailv3::KeyOrValueEquality<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_const_slang::ast::SystemSubroutine_*>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>_>_>,_std::allocator<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_const_slang::ast::SystemSubroutine_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_const_slang::ast::SystemSubroutine_*>_>_>_>
  .max_lookups = '\x03';
  (this->methodMap).
  super_sherwood_v3_table<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_const_slang::ast::SystemSubroutine_*>,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_slang::Hasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>_>,_ska::detailv3::KeyOrValueHasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_const_slang::ast::SystemSubroutine_*>,_slang::Hasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>_>_>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>_>,_ska::detailv3::KeyOrValueEquality<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_const_slang::ast::SystemSubroutine_*>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>_>_>,_std::allocator<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_const_slang::ast::SystemSubroutine_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_const_slang::ast::SystemSubroutine_*>_>_>_>
  ._max_load_factor = 0.5;
  (this->methodMap).
  super_sherwood_v3_table<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_const_slang::ast::SystemSubroutine_*>,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_slang::Hasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>_>,_ska::detailv3::KeyOrValueHasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_const_slang::ast::SystemSubroutine_*>,_slang::Hasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>_>_>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>_>,_ska::detailv3::KeyOrValueEquality<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_const_slang::ast::SystemSubroutine_*>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>_>_>,_std::allocator<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_const_slang::ast::SystemSubroutine_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_const_slang::ast::SystemSubroutine_*>_>_>_>
  .num_elements = 0;
  psVar12 = ska::detailv3::
            empty_default_table<std::pair<void_const*,nonstd::span_lite::span<slang::ast::AttributeSymbol_const*const,18446744073709551615ul>>>
                      ();
  (this->attributeMap).
  super_sherwood_v3_table<std::pair<const_void_*,_nonstd::span_lite::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>,_const_void_*,_slang::Hasher<const_void_*>,_ska::detailv3::KeyOrValueHasher<const_void_*,_std::pair<const_void_*,_nonstd::span_lite::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>,_slang::Hasher<const_void_*>_>,_std::equal_to<const_void_*>,_ska::detailv3::KeyOrValueEquality<const_void_*,_std::pair<const_void_*,_nonstd::span_lite::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>,_std::equal_to<const_void_*>_>,_std::allocator<std::pair<const_void_*,_nonstd::span_lite::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<const_void_*,_nonstd::span_lite::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>_>_>_>
  .entries = psVar12;
  (this->attributeMap).
  super_sherwood_v3_table<std::pair<const_void_*,_nonstd::span_lite::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>,_const_void_*,_slang::Hasher<const_void_*>,_ska::detailv3::KeyOrValueHasher<const_void_*,_std::pair<const_void_*,_nonstd::span_lite::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>,_slang::Hasher<const_void_*>_>,_std::equal_to<const_void_*>,_ska::detailv3::KeyOrValueEquality<const_void_*,_std::pair<const_void_*,_nonstd::span_lite::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>,_std::equal_to<const_void_*>_>,_std::allocator<std::pair<const_void_*,_nonstd::span_lite::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<const_void_*,_nonstd::span_lite::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>_>_>_>
  .num_slots_minus_one = 0;
  (this->attributeMap).
  super_sherwood_v3_table<std::pair<const_void_*,_nonstd::span_lite::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>,_const_void_*,_slang::Hasher<const_void_*>,_ska::detailv3::KeyOrValueHasher<const_void_*,_std::pair<const_void_*,_nonstd::span_lite::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>,_slang::Hasher<const_void_*>_>,_std::equal_to<const_void_*>,_ska::detailv3::KeyOrValueEquality<const_void_*,_std::pair<const_void_*,_nonstd::span_lite::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>,_std::equal_to<const_void_*>_>,_std::allocator<std::pair<const_void_*,_nonstd::span_lite::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<const_void_*,_nonstd::span_lite::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>_>_>_>
  .hash_policy = '?';
  (this->attributeMap).
  super_sherwood_v3_table<std::pair<const_void_*,_nonstd::span_lite::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>,_const_void_*,_slang::Hasher<const_void_*>,_ska::detailv3::KeyOrValueHasher<const_void_*,_std::pair<const_void_*,_nonstd::span_lite::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>,_slang::Hasher<const_void_*>_>,_std::equal_to<const_void_*>,_ska::detailv3::KeyOrValueEquality<const_void_*,_std::pair<const_void_*,_nonstd::span_lite::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>,_std::equal_to<const_void_*>_>,_std::allocator<std::pair<const_void_*,_nonstd::span_lite::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<const_void_*,_nonstd::span_lite::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>_>_>_>
  .max_lookups = '\x03';
  (this->attributeMap).
  super_sherwood_v3_table<std::pair<const_void_*,_nonstd::span_lite::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>,_const_void_*,_slang::Hasher<const_void_*>,_ska::detailv3::KeyOrValueHasher<const_void_*,_std::pair<const_void_*,_nonstd::span_lite::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>,_slang::Hasher<const_void_*>_>,_std::equal_to<const_void_*>,_ska::detailv3::KeyOrValueEquality<const_void_*,_std::pair<const_void_*,_nonstd::span_lite::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>,_std::equal_to<const_void_*>_>,_std::allocator<std::pair<const_void_*,_nonstd::span_lite::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<const_void_*,_nonstd::span_lite::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>_>_>_>
  ._max_load_factor = 0.5;
  (this->attributeMap).
  super_sherwood_v3_table<std::pair<const_void_*,_nonstd::span_lite::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>,_const_void_*,_slang::Hasher<const_void_*>,_ska::detailv3::KeyOrValueHasher<const_void_*,_std::pair<const_void_*,_nonstd::span_lite::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>,_slang::Hasher<const_void_*>_>,_std::equal_to<const_void_*>,_ska::detailv3::KeyOrValueEquality<const_void_*,_std::pair<const_void_*,_nonstd::span_lite::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>,_std::equal_to<const_void_*>_>,_std::allocator<std::pair<const_void_*,_nonstd::span_lite::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<const_void_*,_nonstd::span_lite::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>_>_>_>
  .num_elements = 0;
  psVar13 = ska::detailv3::empty_default_table<std::basic_string_view<char,std::char_traits<char>>>
                      ();
  (this->globalInstantiations).
  super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  .entries = psVar13;
  (this->globalInstantiations).
  super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  .num_slots_minus_one = 0;
  (this->globalInstantiations).
  super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  .hash_policy = '?';
  (this->globalInstantiations).
  super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  .max_lookups = '\x03';
  (this->globalInstantiations).
  super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  ._max_load_factor = 0.5;
  (this->globalInstantiations).
  super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  .num_elements = 0;
  psVar14 = ska::detailv3::
            empty_default_table<std::pair<slang::syntax::ModuleDeclarationSyntax_const*,slang::ast::Compilation::DefinitionMetadata>>
                      ();
  (this->definitionMetadata).
  super_sherwood_v3_table<std::pair<const_slang::syntax::ModuleDeclarationSyntax_*,_slang::ast::Compilation::DefinitionMetadata>,_const_slang::syntax::ModuleDeclarationSyntax_*,_slang::Hasher<const_slang::syntax::ModuleDeclarationSyntax_*>,_ska::detailv3::KeyOrValueHasher<const_slang::syntax::ModuleDeclarationSyntax_*,_std::pair<const_slang::syntax::ModuleDeclarationSyntax_*,_slang::ast::Compilation::DefinitionMetadata>,_slang::Hasher<const_slang::syntax::ModuleDeclarationSyntax_*>_>,_std::equal_to<const_slang::syntax::ModuleDeclarationSyntax_*>,_ska::detailv3::KeyOrValueEquality<const_slang::syntax::ModuleDeclarationSyntax_*,_std::pair<const_slang::syntax::ModuleDeclarationSyntax_*,_slang::ast::Compilation::DefinitionMetadata>,_std::equal_to<const_slang::syntax::ModuleDeclarationSyntax_*>_>,_std::allocator<std::pair<const_slang::syntax::ModuleDeclarationSyntax_*,_slang::ast::Compilation::DefinitionMetadata>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<const_slang::syntax::ModuleDeclarationSyntax_*,_slang::ast::Compilation::DefinitionMetadata>_>_>_>
  .entries = psVar14;
  (this->definitionMetadata).
  super_sherwood_v3_table<std::pair<const_slang::syntax::ModuleDeclarationSyntax_*,_slang::ast::Compilation::DefinitionMetadata>,_const_slang::syntax::ModuleDeclarationSyntax_*,_slang::Hasher<const_slang::syntax::ModuleDeclarationSyntax_*>,_ska::detailv3::KeyOrValueHasher<const_slang::syntax::ModuleDeclarationSyntax_*,_std::pair<const_slang::syntax::ModuleDeclarationSyntax_*,_slang::ast::Compilation::DefinitionMetadata>,_slang::Hasher<const_slang::syntax::ModuleDeclarationSyntax_*>_>,_std::equal_to<const_slang::syntax::ModuleDeclarationSyntax_*>,_ska::detailv3::KeyOrValueEquality<const_slang::syntax::ModuleDeclarationSyntax_*,_std::pair<const_slang::syntax::ModuleDeclarationSyntax_*,_slang::ast::Compilation::DefinitionMetadata>,_std::equal_to<const_slang::syntax::ModuleDeclarationSyntax_*>_>,_std::allocator<std::pair<const_slang::syntax::ModuleDeclarationSyntax_*,_slang::ast::Compilation::DefinitionMetadata>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<const_slang::syntax::ModuleDeclarationSyntax_*,_slang::ast::Compilation::DefinitionMetadata>_>_>_>
  .num_slots_minus_one = 0;
  (this->definitionMetadata).
  super_sherwood_v3_table<std::pair<const_slang::syntax::ModuleDeclarationSyntax_*,_slang::ast::Compilation::DefinitionMetadata>,_const_slang::syntax::ModuleDeclarationSyntax_*,_slang::Hasher<const_slang::syntax::ModuleDeclarationSyntax_*>,_ska::detailv3::KeyOrValueHasher<const_slang::syntax::ModuleDeclarationSyntax_*,_std::pair<const_slang::syntax::ModuleDeclarationSyntax_*,_slang::ast::Compilation::DefinitionMetadata>,_slang::Hasher<const_slang::syntax::ModuleDeclarationSyntax_*>_>,_std::equal_to<const_slang::syntax::ModuleDeclarationSyntax_*>,_ska::detailv3::KeyOrValueEquality<const_slang::syntax::ModuleDeclarationSyntax_*,_std::pair<const_slang::syntax::ModuleDeclarationSyntax_*,_slang::ast::Compilation::DefinitionMetadata>,_std::equal_to<const_slang::syntax::ModuleDeclarationSyntax_*>_>,_std::allocator<std::pair<const_slang::syntax::ModuleDeclarationSyntax_*,_slang::ast::Compilation::DefinitionMetadata>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<const_slang::syntax::ModuleDeclarationSyntax_*,_slang::ast::Compilation::DefinitionMetadata>_>_>_>
  .hash_policy = '?';
  (this->definitionMetadata).
  super_sherwood_v3_table<std::pair<const_slang::syntax::ModuleDeclarationSyntax_*,_slang::ast::Compilation::DefinitionMetadata>,_const_slang::syntax::ModuleDeclarationSyntax_*,_slang::Hasher<const_slang::syntax::ModuleDeclarationSyntax_*>,_ska::detailv3::KeyOrValueHasher<const_slang::syntax::ModuleDeclarationSyntax_*,_std::pair<const_slang::syntax::ModuleDeclarationSyntax_*,_slang::ast::Compilation::DefinitionMetadata>,_slang::Hasher<const_slang::syntax::ModuleDeclarationSyntax_*>_>,_std::equal_to<const_slang::syntax::ModuleDeclarationSyntax_*>,_ska::detailv3::KeyOrValueEquality<const_slang::syntax::ModuleDeclarationSyntax_*,_std::pair<const_slang::syntax::ModuleDeclarationSyntax_*,_slang::ast::Compilation::DefinitionMetadata>,_std::equal_to<const_slang::syntax::ModuleDeclarationSyntax_*>_>,_std::allocator<std::pair<const_slang::syntax::ModuleDeclarationSyntax_*,_slang::ast::Compilation::DefinitionMetadata>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<const_slang::syntax::ModuleDeclarationSyntax_*,_slang::ast::Compilation::DefinitionMetadata>_>_>_>
  .max_lookups = '\x03';
  (this->definitionMetadata).
  super_sherwood_v3_table<std::pair<const_slang::syntax::ModuleDeclarationSyntax_*,_slang::ast::Compilation::DefinitionMetadata>,_const_slang::syntax::ModuleDeclarationSyntax_*,_slang::Hasher<const_slang::syntax::ModuleDeclarationSyntax_*>,_ska::detailv3::KeyOrValueHasher<const_slang::syntax::ModuleDeclarationSyntax_*,_std::pair<const_slang::syntax::ModuleDeclarationSyntax_*,_slang::ast::Compilation::DefinitionMetadata>,_slang::Hasher<const_slang::syntax::ModuleDeclarationSyntax_*>_>,_std::equal_to<const_slang::syntax::ModuleDeclarationSyntax_*>,_ska::detailv3::KeyOrValueEquality<const_slang::syntax::ModuleDeclarationSyntax_*,_std::pair<const_slang::syntax::ModuleDeclarationSyntax_*,_slang::ast::Compilation::DefinitionMetadata>,_std::equal_to<const_slang::syntax::ModuleDeclarationSyntax_*>_>,_std::allocator<std::pair<const_slang::syntax::ModuleDeclarationSyntax_*,_slang::ast::Compilation::DefinitionMetadata>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<const_slang::syntax::ModuleDeclarationSyntax_*,_slang::ast::Compilation::DefinitionMetadata>_>_>_>
  ._max_load_factor = 0.5;
  (this->definitionMetadata).
  super_sherwood_v3_table<std::pair<const_slang::syntax::ModuleDeclarationSyntax_*,_slang::ast::Compilation::DefinitionMetadata>,_const_slang::syntax::ModuleDeclarationSyntax_*,_slang::Hasher<const_slang::syntax::ModuleDeclarationSyntax_*>,_ska::detailv3::KeyOrValueHasher<const_slang::syntax::ModuleDeclarationSyntax_*,_std::pair<const_slang::syntax::ModuleDeclarationSyntax_*,_slang::ast::Compilation::DefinitionMetadata>,_slang::Hasher<const_slang::syntax::ModuleDeclarationSyntax_*>_>,_std::equal_to<const_slang::syntax::ModuleDeclarationSyntax_*>,_ska::detailv3::KeyOrValueEquality<const_slang::syntax::ModuleDeclarationSyntax_*,_std::pair<const_slang::syntax::ModuleDeclarationSyntax_*,_slang::ast::Compilation::DefinitionMetadata>,_std::equal_to<const_slang::syntax::ModuleDeclarationSyntax_*>_>,_std::allocator<std::pair<const_slang::syntax::ModuleDeclarationSyntax_*,_slang::ast::Compilation::DefinitionMetadata>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<const_slang::syntax::ModuleDeclarationSyntax_*,_slang::ast::Compilation::DefinitionMetadata>_>_>_>
  .num_elements = 0;
  psVar15 = ska::detailv3::
            empty_default_table<std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,std::unique_ptr<slang::ast::Definition,std::default_delete<slang::ast::Definition>>>>
                      ();
  (this->definitionMap).
  super_sherwood_v3_table<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_slang::Hasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_ska::detailv3::KeyOrValueHasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>,_slang::Hasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>_>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_ska::detailv3::KeyOrValueEquality<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>_>,_std::allocator<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>_>_>_>
  .entries = psVar15;
  (this->definitionMap).
  super_sherwood_v3_table<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_slang::Hasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_ska::detailv3::KeyOrValueHasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>,_slang::Hasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>_>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_ska::detailv3::KeyOrValueEquality<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>_>,_std::allocator<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>_>_>_>
  .num_slots_minus_one = 0;
  (this->definitionMap).
  super_sherwood_v3_table<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_slang::Hasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_ska::detailv3::KeyOrValueHasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>,_slang::Hasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>_>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_ska::detailv3::KeyOrValueEquality<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>_>,_std::allocator<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>_>_>_>
  .hash_policy = '?';
  (this->definitionMap).
  super_sherwood_v3_table<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_slang::Hasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_ska::detailv3::KeyOrValueHasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>,_slang::Hasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>_>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_ska::detailv3::KeyOrValueEquality<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>_>,_std::allocator<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>_>_>_>
  .max_lookups = '\x03';
  (this->definitionMap).
  super_sherwood_v3_table<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_slang::Hasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_ska::detailv3::KeyOrValueHasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>,_slang::Hasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>_>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_ska::detailv3::KeyOrValueEquality<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>_>,_std::allocator<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>_>_>_>
  ._max_load_factor = 0.5;
  (this->definitionMap).
  super_sherwood_v3_table<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_slang::Hasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_ska::detailv3::KeyOrValueHasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>,_slang::Hasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>_>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_ska::detailv3::KeyOrValueEquality<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>_>,_std::allocator<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>_>_>_>
  .num_elements = 0;
  psVar16 = ska::detailv3::
            empty_default_table<std::pair<std::tuple<slang::DiagCode,slang::SourceLocation>,std::vector<slang::Diagnostic,std::allocator<slang::Diagnostic>>>>
                      ();
  (this->diagMap).
  super_sherwood_v3_table<std::pair<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>,_std::tuple<slang::DiagCode,_slang::SourceLocation>,_slang::Hasher<std::tuple<slang::DiagCode,_slang::SourceLocation>_>,_ska::detailv3::KeyOrValueHasher<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::pair<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>,_slang::Hasher<std::tuple<slang::DiagCode,_slang::SourceLocation>_>_>,_std::equal_to<std::tuple<slang::DiagCode,_slang::SourceLocation>_>,_ska::detailv3::KeyOrValueEquality<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::pair<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>,_std::equal_to<std::tuple<slang::DiagCode,_slang::SourceLocation>_>_>,_std::allocator<std::pair<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>_>_>_>
  .entries = psVar16;
  (this->diagMap).
  super_sherwood_v3_table<std::pair<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>,_std::tuple<slang::DiagCode,_slang::SourceLocation>,_slang::Hasher<std::tuple<slang::DiagCode,_slang::SourceLocation>_>,_ska::detailv3::KeyOrValueHasher<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::pair<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>,_slang::Hasher<std::tuple<slang::DiagCode,_slang::SourceLocation>_>_>,_std::equal_to<std::tuple<slang::DiagCode,_slang::SourceLocation>_>,_ska::detailv3::KeyOrValueEquality<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::pair<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>,_std::equal_to<std::tuple<slang::DiagCode,_slang::SourceLocation>_>_>,_std::allocator<std::pair<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>_>_>_>
  .num_slots_minus_one = 0;
  (this->diagMap).
  super_sherwood_v3_table<std::pair<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>,_std::tuple<slang::DiagCode,_slang::SourceLocation>,_slang::Hasher<std::tuple<slang::DiagCode,_slang::SourceLocation>_>,_ska::detailv3::KeyOrValueHasher<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::pair<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>,_slang::Hasher<std::tuple<slang::DiagCode,_slang::SourceLocation>_>_>,_std::equal_to<std::tuple<slang::DiagCode,_slang::SourceLocation>_>,_ska::detailv3::KeyOrValueEquality<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::pair<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>,_std::equal_to<std::tuple<slang::DiagCode,_slang::SourceLocation>_>_>,_std::allocator<std::pair<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>_>_>_>
  .hash_policy = '?';
  (this->diagMap).
  super_sherwood_v3_table<std::pair<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>,_std::tuple<slang::DiagCode,_slang::SourceLocation>,_slang::Hasher<std::tuple<slang::DiagCode,_slang::SourceLocation>_>,_ska::detailv3::KeyOrValueHasher<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::pair<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>,_slang::Hasher<std::tuple<slang::DiagCode,_slang::SourceLocation>_>_>,_std::equal_to<std::tuple<slang::DiagCode,_slang::SourceLocation>_>,_ska::detailv3::KeyOrValueEquality<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::pair<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>,_std::equal_to<std::tuple<slang::DiagCode,_slang::SourceLocation>_>_>,_std::allocator<std::pair<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>_>_>_>
  .max_lookups = '\x03';
  (this->diagMap).
  super_sherwood_v3_table<std::pair<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>,_std::tuple<slang::DiagCode,_slang::SourceLocation>,_slang::Hasher<std::tuple<slang::DiagCode,_slang::SourceLocation>_>,_ska::detailv3::KeyOrValueHasher<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::pair<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>,_slang::Hasher<std::tuple<slang::DiagCode,_slang::SourceLocation>_>_>,_std::equal_to<std::tuple<slang::DiagCode,_slang::SourceLocation>_>,_ska::detailv3::KeyOrValueEquality<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::pair<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>,_std::equal_to<std::tuple<slang::DiagCode,_slang::SourceLocation>_>_>,_std::allocator<std::pair<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>_>_>_>
  ._max_load_factor = 0.5;
  (this->diagMap).
  super_sherwood_v3_table<std::pair<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>,_std::tuple<slang::DiagCode,_slang::SourceLocation>,_slang::Hasher<std::tuple<slang::DiagCode,_slang::SourceLocation>_>,_ska::detailv3::KeyOrValueHasher<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::pair<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>,_slang::Hasher<std::tuple<slang::DiagCode,_slang::SourceLocation>_>_>,_std::equal_to<std::tuple<slang::DiagCode,_slang::SourceLocation>_>,_ska::detailv3::KeyOrValueEquality<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::pair<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>,_std::equal_to<std::tuple<slang::DiagCode,_slang::SourceLocation>_>_>,_std::allocator<std::pair<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>_>_>_>
  .num_elements = 0;
  local_d8 = &this->genericClassAllocator;
  local_98 = &this->constantAllocator;
  psVar17 = ska::detailv3::
            empty_default_table<std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,std::tuple<slang::syntax::SyntaxNode_const*,slang::syntax::ScopedNameSyntax_const*,slang::ast::SymbolIndex,bool>>>
                      ();
  (this->outOfBlockDecls).super_sherwood_v3_table<_a9d55d12_>.entries = psVar17;
  (this->outOfBlockDecls).super_sherwood_v3_table<_a9d55d12_>.num_slots_minus_one = 0;
  (this->outOfBlockDecls).super_sherwood_v3_table<_a9d55d12_>.hash_policy = '?';
  (this->outOfBlockDecls).super_sherwood_v3_table<_a9d55d12_>.max_lookups = '\x03';
  (this->outOfBlockDecls).super_sherwood_v3_table<_a9d55d12_>._max_load_factor = 0.5;
  (this->outOfBlockDecls).super_sherwood_v3_table<_a9d55d12_>.num_elements = 0;
  (this->root)._M_t.
  super___uniq_ptr_impl<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>._M_t.
  super__Tuple_impl<0UL,_slang::ast::RootSymbol_*,_std::default_delete<slang::ast::RootSymbol>_>.
  super__Head_base<0UL,_slang::ast::RootSymbol_*,_false>._M_head_impl = (RootSymbol *)0x0;
  this->sourceManager = (SourceManager *)0x0;
  this->numErrors = 0;
  (this->defaultTimeScale).base.unit = Seconds;
  *(undefined4 *)&(this->defaultTimeScale).base.magnitude = 0x10001;
  this->finalizing = false;
  this->typoCorrections = 0;
  this->nextEnumSystemId = 1;
  this->nextStructSystemId = 1;
  this->nextUnionSystemId = 1;
  local_b0 = &this->tempDiag;
  Diagnostic::Diagnostic(local_b0,(DiagCode)0x0,(SourceLocation)0x0);
  (this->cachedParseDiagnostics).super__Optional_base<slang::Diagnostics,_false,_false>._M_payload.
  super__Optional_payload<slang::Diagnostics,_true,_false,_false>.
  super__Optional_payload_base<slang::Diagnostics>._M_engaged = false;
  (this->cachedSemanticDiagnostics).super__Optional_base<slang::Diagnostics,_false,_false>.
  _M_payload.super__Optional_payload<slang::Diagnostics,_true,_false,_false>.
  super__Optional_payload_base<slang::Diagnostics>._M_engaged = false;
  (this->cachedAllDiagnostics).super__Optional_base<slang::Diagnostics,_false,_false>._M_payload.
  super__Optional_payload<slang::Diagnostics,_true,_false,_false>.
  super__Optional_payload_base<slang::Diagnostics>._M_engaged = false;
  (this->compilationUnits).
  super__Vector_base<const_slang::ast::CompilationUnitSymbol_*,_std::allocator<const_slang::ast::CompilationUnitSymbol_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->compilationUnits).
  super__Vector_base<const_slang::ast::CompilationUnitSymbol_*,_std::allocator<const_slang::ast::CompilationUnitSymbol_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->compilationUnits).
  super__Vector_base<const_slang::ast::CompilationUnitSymbol_*,_std::allocator<const_slang::ast::CompilationUnitSymbol_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->syntaxTrees).
  super__Vector_base<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->syntaxTrees).
  super__Vector_base<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->syntaxTrees).
  super__Vector_base<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->unreferencedDefs).
  super__Vector_base<const_slang::ast::Definition_*,_std::allocator<const_slang::ast::Definition_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->unreferencedDefs).
  super__Vector_base<const_slang::ast::Definition_*,_std::allocator<const_slang::ast::Definition_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->unreferencedDefs).
  super__Vector_base<const_slang::ast::Definition_*,_std::allocator<const_slang::ast::Definition_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8 = &this->pointerMapAllocator;
  local_a0 = &this->symbolMapAllocator;
  psVar18 = ska::detailv3::
            empty_default_table<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PrimitiveSymbol_const*>>
                      ();
  (this->udpMap).
  super_sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PrimitiveSymbol_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PrimitiveSymbol_*>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PrimitiveSymbol_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PrimitiveSymbol_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PrimitiveSymbol_*>_>_>_>
  .entries = psVar18;
  (this->udpMap).
  super_sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PrimitiveSymbol_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PrimitiveSymbol_*>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PrimitiveSymbol_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PrimitiveSymbol_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PrimitiveSymbol_*>_>_>_>
  .num_slots_minus_one = 0;
  (this->udpMap).
  super_sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PrimitiveSymbol_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PrimitiveSymbol_*>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PrimitiveSymbol_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PrimitiveSymbol_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PrimitiveSymbol_*>_>_>_>
  .hash_policy = '?';
  (this->udpMap).
  super_sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PrimitiveSymbol_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PrimitiveSymbol_*>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PrimitiveSymbol_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PrimitiveSymbol_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PrimitiveSymbol_*>_>_>_>
  .max_lookups = '\x03';
  (this->udpMap).
  super_sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PrimitiveSymbol_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PrimitiveSymbol_*>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PrimitiveSymbol_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PrimitiveSymbol_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PrimitiveSymbol_*>_>_>_>
  ._max_load_factor = 0.5;
  (this->udpMap).
  super_sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PrimitiveSymbol_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PrimitiveSymbol_*>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PrimitiveSymbol_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PrimitiveSymbol_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PrimitiveSymbol_*>_>_>_>
  .num_elements = 0;
  psVar18 = ska::detailv3::
            empty_default_table<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PrimitiveSymbol_const*>>
                      ();
  (this->gateMap).
  super_sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PrimitiveSymbol_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PrimitiveSymbol_*>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PrimitiveSymbol_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PrimitiveSymbol_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PrimitiveSymbol_*>_>_>_>
  .entries = psVar18;
  (this->gateMap).
  super_sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PrimitiveSymbol_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PrimitiveSymbol_*>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PrimitiveSymbol_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PrimitiveSymbol_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PrimitiveSymbol_*>_>_>_>
  .num_slots_minus_one = 0;
  (this->gateMap).
  super_sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PrimitiveSymbol_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PrimitiveSymbol_*>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PrimitiveSymbol_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PrimitiveSymbol_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PrimitiveSymbol_*>_>_>_>
  .hash_policy = '?';
  (this->gateMap).
  super_sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PrimitiveSymbol_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PrimitiveSymbol_*>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PrimitiveSymbol_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PrimitiveSymbol_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PrimitiveSymbol_*>_>_>_>
  .max_lookups = '\x03';
  (this->gateMap).
  super_sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PrimitiveSymbol_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PrimitiveSymbol_*>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PrimitiveSymbol_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PrimitiveSymbol_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PrimitiveSymbol_*>_>_>_>
  ._max_load_factor = 0.5;
  (this->gateMap).
  super_sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PrimitiveSymbol_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PrimitiveSymbol_*>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PrimitiveSymbol_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PrimitiveSymbol_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PrimitiveSymbol_*>_>_>_>
  .num_elements = 0;
  psVar19 = ska::detailv3::
            empty_default_table<std::pair<slang::ast::Definition_const*,std::vector<slang::syntax::BindDirectiveSyntax_const*,std::allocator<slang::syntax::BindDirectiveSyntax_const*>>>>
                      ();
  (this->bindDirectivesByDef).
  super_sherwood_v3_table<std::pair<const_slang::ast::Definition_*,_std::vector<const_slang::syntax::BindDirectiveSyntax_*,_std::allocator<const_slang::syntax::BindDirectiveSyntax_*>_>_>,_const_slang::ast::Definition_*,_slang::Hasher<const_slang::ast::Definition_*>,_ska::detailv3::KeyOrValueHasher<const_slang::ast::Definition_*,_std::pair<const_slang::ast::Definition_*,_std::vector<const_slang::syntax::BindDirectiveSyntax_*,_std::allocator<const_slang::syntax::BindDirectiveSyntax_*>_>_>,_slang::Hasher<const_slang::ast::Definition_*>_>,_std::equal_to<const_slang::ast::Definition_*>,_ska::detailv3::KeyOrValueEquality<const_slang::ast::Definition_*,_std::pair<const_slang::ast::Definition_*,_std::vector<const_slang::syntax::BindDirectiveSyntax_*,_std::allocator<const_slang::syntax::BindDirectiveSyntax_*>_>_>,_std::equal_to<const_slang::ast::Definition_*>_>,_std::allocator<std::pair<const_slang::ast::Definition_*,_std::vector<const_slang::syntax::BindDirectiveSyntax_*,_std::allocator<const_slang::syntax::BindDirectiveSyntax_*>_>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<const_slang::ast::Definition_*,_std::vector<const_slang::syntax::BindDirectiveSyntax_*,_std::allocator<const_slang::syntax::BindDirectiveSyntax_*>_>_>_>_>_>
  .entries = psVar19;
  (this->bindDirectivesByDef).
  super_sherwood_v3_table<std::pair<const_slang::ast::Definition_*,_std::vector<const_slang::syntax::BindDirectiveSyntax_*,_std::allocator<const_slang::syntax::BindDirectiveSyntax_*>_>_>,_const_slang::ast::Definition_*,_slang::Hasher<const_slang::ast::Definition_*>,_ska::detailv3::KeyOrValueHasher<const_slang::ast::Definition_*,_std::pair<const_slang::ast::Definition_*,_std::vector<const_slang::syntax::BindDirectiveSyntax_*,_std::allocator<const_slang::syntax::BindDirectiveSyntax_*>_>_>,_slang::Hasher<const_slang::ast::Definition_*>_>,_std::equal_to<const_slang::ast::Definition_*>,_ska::detailv3::KeyOrValueEquality<const_slang::ast::Definition_*,_std::pair<const_slang::ast::Definition_*,_std::vector<const_slang::syntax::BindDirectiveSyntax_*,_std::allocator<const_slang::syntax::BindDirectiveSyntax_*>_>_>,_std::equal_to<const_slang::ast::Definition_*>_>,_std::allocator<std::pair<const_slang::ast::Definition_*,_std::vector<const_slang::syntax::BindDirectiveSyntax_*,_std::allocator<const_slang::syntax::BindDirectiveSyntax_*>_>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<const_slang::ast::Definition_*,_std::vector<const_slang::syntax::BindDirectiveSyntax_*,_std::allocator<const_slang::syntax::BindDirectiveSyntax_*>_>_>_>_>_>
  .num_slots_minus_one = 0;
  (this->bindDirectivesByDef).
  super_sherwood_v3_table<std::pair<const_slang::ast::Definition_*,_std::vector<const_slang::syntax::BindDirectiveSyntax_*,_std::allocator<const_slang::syntax::BindDirectiveSyntax_*>_>_>,_const_slang::ast::Definition_*,_slang::Hasher<const_slang::ast::Definition_*>,_ska::detailv3::KeyOrValueHasher<const_slang::ast::Definition_*,_std::pair<const_slang::ast::Definition_*,_std::vector<const_slang::syntax::BindDirectiveSyntax_*,_std::allocator<const_slang::syntax::BindDirectiveSyntax_*>_>_>,_slang::Hasher<const_slang::ast::Definition_*>_>,_std::equal_to<const_slang::ast::Definition_*>,_ska::detailv3::KeyOrValueEquality<const_slang::ast::Definition_*,_std::pair<const_slang::ast::Definition_*,_std::vector<const_slang::syntax::BindDirectiveSyntax_*,_std::allocator<const_slang::syntax::BindDirectiveSyntax_*>_>_>,_std::equal_to<const_slang::ast::Definition_*>_>,_std::allocator<std::pair<const_slang::ast::Definition_*,_std::vector<const_slang::syntax::BindDirectiveSyntax_*,_std::allocator<const_slang::syntax::BindDirectiveSyntax_*>_>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<const_slang::ast::Definition_*,_std::vector<const_slang::syntax::BindDirectiveSyntax_*,_std::allocator<const_slang::syntax::BindDirectiveSyntax_*>_>_>_>_>_>
  .hash_policy = '?';
  (this->bindDirectivesByDef).
  super_sherwood_v3_table<std::pair<const_slang::ast::Definition_*,_std::vector<const_slang::syntax::BindDirectiveSyntax_*,_std::allocator<const_slang::syntax::BindDirectiveSyntax_*>_>_>,_const_slang::ast::Definition_*,_slang::Hasher<const_slang::ast::Definition_*>,_ska::detailv3::KeyOrValueHasher<const_slang::ast::Definition_*,_std::pair<const_slang::ast::Definition_*,_std::vector<const_slang::syntax::BindDirectiveSyntax_*,_std::allocator<const_slang::syntax::BindDirectiveSyntax_*>_>_>,_slang::Hasher<const_slang::ast::Definition_*>_>,_std::equal_to<const_slang::ast::Definition_*>,_ska::detailv3::KeyOrValueEquality<const_slang::ast::Definition_*,_std::pair<const_slang::ast::Definition_*,_std::vector<const_slang::syntax::BindDirectiveSyntax_*,_std::allocator<const_slang::syntax::BindDirectiveSyntax_*>_>_>,_std::equal_to<const_slang::ast::Definition_*>_>,_std::allocator<std::pair<const_slang::ast::Definition_*,_std::vector<const_slang::syntax::BindDirectiveSyntax_*,_std::allocator<const_slang::syntax::BindDirectiveSyntax_*>_>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<const_slang::ast::Definition_*,_std::vector<const_slang::syntax::BindDirectiveSyntax_*,_std::allocator<const_slang::syntax::BindDirectiveSyntax_*>_>_>_>_>_>
  .max_lookups = '\x03';
  (this->bindDirectivesByDef).
  super_sherwood_v3_table<std::pair<const_slang::ast::Definition_*,_std::vector<const_slang::syntax::BindDirectiveSyntax_*,_std::allocator<const_slang::syntax::BindDirectiveSyntax_*>_>_>,_const_slang::ast::Definition_*,_slang::Hasher<const_slang::ast::Definition_*>,_ska::detailv3::KeyOrValueHasher<const_slang::ast::Definition_*,_std::pair<const_slang::ast::Definition_*,_std::vector<const_slang::syntax::BindDirectiveSyntax_*,_std::allocator<const_slang::syntax::BindDirectiveSyntax_*>_>_>,_slang::Hasher<const_slang::ast::Definition_*>_>,_std::equal_to<const_slang::ast::Definition_*>,_ska::detailv3::KeyOrValueEquality<const_slang::ast::Definition_*,_std::pair<const_slang::ast::Definition_*,_std::vector<const_slang::syntax::BindDirectiveSyntax_*,_std::allocator<const_slang::syntax::BindDirectiveSyntax_*>_>_>,_std::equal_to<const_slang::ast::Definition_*>_>,_std::allocator<std::pair<const_slang::ast::Definition_*,_std::vector<const_slang::syntax::BindDirectiveSyntax_*,_std::allocator<const_slang::syntax::BindDirectiveSyntax_*>_>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<const_slang::ast::Definition_*,_std::vector<const_slang::syntax::BindDirectiveSyntax_*,_std::allocator<const_slang::syntax::BindDirectiveSyntax_*>_>_>_>_>_>
  ._max_load_factor = 0.5;
  (this->bindDirectivesByDef).
  super_sherwood_v3_table<std::pair<const_slang::ast::Definition_*,_std::vector<const_slang::syntax::BindDirectiveSyntax_*,_std::allocator<const_slang::syntax::BindDirectiveSyntax_*>_>_>,_const_slang::ast::Definition_*,_slang::Hasher<const_slang::ast::Definition_*>,_ska::detailv3::KeyOrValueHasher<const_slang::ast::Definition_*,_std::pair<const_slang::ast::Definition_*,_std::vector<const_slang::syntax::BindDirectiveSyntax_*,_std::allocator<const_slang::syntax::BindDirectiveSyntax_*>_>_>,_slang::Hasher<const_slang::ast::Definition_*>_>,_std::equal_to<const_slang::ast::Definition_*>,_ska::detailv3::KeyOrValueEquality<const_slang::ast::Definition_*,_std::pair<const_slang::ast::Definition_*,_std::vector<const_slang::syntax::BindDirectiveSyntax_*,_std::allocator<const_slang::syntax::BindDirectiveSyntax_*>_>_>,_std::equal_to<const_slang::ast::Definition_*>_>,_std::allocator<std::pair<const_slang::ast::Definition_*,_std::vector<const_slang::syntax::BindDirectiveSyntax_*,_std::allocator<const_slang::syntax::BindDirectiveSyntax_*>_>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<const_slang::ast::Definition_*,_std::vector<const_slang::syntax::BindDirectiveSyntax_*,_std::allocator<const_slang::syntax::BindDirectiveSyntax_*>_>_>_>_>_>
  .num_elements = 0;
  psVar20 = ska::detailv3::empty_default_table<slang::syntax::BindDirectiveSyntax_const*>();
  (this->seenBindDirectives).
  super_sherwood_v3_table<const_slang::syntax::BindDirectiveSyntax_*,_const_slang::syntax::BindDirectiveSyntax_*,_slang::Hasher<const_slang::syntax::BindDirectiveSyntax_*>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<const_slang::syntax::BindDirectiveSyntax_*>_>,_std::equal_to<const_slang::syntax::BindDirectiveSyntax_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::syntax::BindDirectiveSyntax_*>_>,_std::allocator<const_slang::syntax::BindDirectiveSyntax_*>,_std::allocator<ska::detailv3::sherwood_v3_entry<const_slang::syntax::BindDirectiveSyntax_*>_>_>
  .entries = psVar20;
  (this->seenBindDirectives).
  super_sherwood_v3_table<const_slang::syntax::BindDirectiveSyntax_*,_const_slang::syntax::BindDirectiveSyntax_*,_slang::Hasher<const_slang::syntax::BindDirectiveSyntax_*>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<const_slang::syntax::BindDirectiveSyntax_*>_>,_std::equal_to<const_slang::syntax::BindDirectiveSyntax_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::syntax::BindDirectiveSyntax_*>_>,_std::allocator<const_slang::syntax::BindDirectiveSyntax_*>,_std::allocator<ska::detailv3::sherwood_v3_entry<const_slang::syntax::BindDirectiveSyntax_*>_>_>
  .num_slots_minus_one = 0;
  (this->seenBindDirectives).
  super_sherwood_v3_table<const_slang::syntax::BindDirectiveSyntax_*,_const_slang::syntax::BindDirectiveSyntax_*,_slang::Hasher<const_slang::syntax::BindDirectiveSyntax_*>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<const_slang::syntax::BindDirectiveSyntax_*>_>,_std::equal_to<const_slang::syntax::BindDirectiveSyntax_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::syntax::BindDirectiveSyntax_*>_>,_std::allocator<const_slang::syntax::BindDirectiveSyntax_*>,_std::allocator<ska::detailv3::sherwood_v3_entry<const_slang::syntax::BindDirectiveSyntax_*>_>_>
  .hash_policy = '?';
  (this->seenBindDirectives).
  super_sherwood_v3_table<const_slang::syntax::BindDirectiveSyntax_*,_const_slang::syntax::BindDirectiveSyntax_*,_slang::Hasher<const_slang::syntax::BindDirectiveSyntax_*>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<const_slang::syntax::BindDirectiveSyntax_*>_>,_std::equal_to<const_slang::syntax::BindDirectiveSyntax_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::syntax::BindDirectiveSyntax_*>_>,_std::allocator<const_slang::syntax::BindDirectiveSyntax_*>,_std::allocator<ska::detailv3::sherwood_v3_entry<const_slang::syntax::BindDirectiveSyntax_*>_>_>
  .max_lookups = '\x03';
  (this->seenBindDirectives).
  super_sherwood_v3_table<const_slang::syntax::BindDirectiveSyntax_*,_const_slang::syntax::BindDirectiveSyntax_*,_slang::Hasher<const_slang::syntax::BindDirectiveSyntax_*>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<const_slang::syntax::BindDirectiveSyntax_*>_>,_std::equal_to<const_slang::syntax::BindDirectiveSyntax_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::syntax::BindDirectiveSyntax_*>_>,_std::allocator<const_slang::syntax::BindDirectiveSyntax_*>,_std::allocator<ska::detailv3::sherwood_v3_entry<const_slang::syntax::BindDirectiveSyntax_*>_>_>
  ._max_load_factor = 0.5;
  (this->seenBindDirectives).
  super_sherwood_v3_table<const_slang::syntax::BindDirectiveSyntax_*,_const_slang::syntax::BindDirectiveSyntax_*,_slang::Hasher<const_slang::syntax::BindDirectiveSyntax_*>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<const_slang::syntax::BindDirectiveSyntax_*>_>,_std::equal_to<const_slang::syntax::BindDirectiveSyntax_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::syntax::BindDirectiveSyntax_*>_>,_std::allocator<const_slang::syntax::BindDirectiveSyntax_*>,_std::allocator<ska::detailv3::sherwood_v3_entry<const_slang::syntax::BindDirectiveSyntax_*>_>_>
  .num_elements = 0;
  psVar21 = ska::detailv3::empty_default_table<std::pair<std::__cxx11::string,slang::ConstantValue>>
                      ();
  (this->paramOverrides).overrides.
  super_sherwood_v3_table<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ConstantValue>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ConstantValue>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ConstantValue>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ConstantValue>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ConstantValue>_>_>_>
  .entries = psVar21;
  (this->paramOverrides).overrides.
  super_sherwood_v3_table<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ConstantValue>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ConstantValue>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ConstantValue>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ConstantValue>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ConstantValue>_>_>_>
  .num_slots_minus_one = 0;
  (this->paramOverrides).overrides.
  super_sherwood_v3_table<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ConstantValue>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ConstantValue>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ConstantValue>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ConstantValue>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ConstantValue>_>_>_>
  .hash_policy = '?';
  (this->paramOverrides).overrides.
  super_sherwood_v3_table<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ConstantValue>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ConstantValue>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ConstantValue>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ConstantValue>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ConstantValue>_>_>_>
  .max_lookups = '\x03';
  (this->paramOverrides).overrides.
  super_sherwood_v3_table<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ConstantValue>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ConstantValue>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ConstantValue>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ConstantValue>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ConstantValue>_>_>_>
  ._max_load_factor = 0.5;
  (this->paramOverrides).overrides.
  super_sherwood_v3_table<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ConstantValue>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ConstantValue>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ConstantValue>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ConstantValue>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ConstantValue>_>_>_>
  .num_elements = 0;
  psVar22 = ska::detailv3::
            empty_default_table<std::pair<std::__cxx11::string,slang::ast::ParamOverrideNode>>();
  (this->paramOverrides).childNodes.
  super_sherwood_v3_table<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>_>_>_>
  .entries = psVar22;
  (this->paramOverrides).childNodes.
  super_sherwood_v3_table<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>_>_>_>
  .num_slots_minus_one = 0;
  (this->paramOverrides).childNodes.
  super_sherwood_v3_table<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>_>_>_>
  .hash_policy = '?';
  (this->paramOverrides).childNodes.
  super_sherwood_v3_table<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>_>_>_>
  .max_lookups = '\x03';
  (this->paramOverrides).childNodes.
  super_sherwood_v3_table<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>_>_>_>
  ._max_load_factor = 0.5;
  (this->paramOverrides).childNodes.
  super_sherwood_v3_table<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>_>_>_>
  .num_elements = 0;
  (this->dpiExports).
  super__Vector_base<std::pair<const_slang::syntax::DPIExportSyntax_*,_const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::syntax::DPIExportSyntax_*,_const_slang::ast::Scope_*>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->dpiExports).
  super__Vector_base<std::pair<const_slang::syntax::DPIExportSyntax_*,_const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::syntax::DPIExportSyntax_*,_const_slang::ast::Scope_*>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->dpiExports).
  super__Vector_base<std::pair<const_slang::syntax::DPIExportSyntax_*,_const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::syntax::DPIExportSyntax_*,_const_slang::ast::Scope_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b8 = &this->paramOverrides;
  psVar23 = ska::detailv3::
            empty_default_table<std::pair<slang::ast::PackageSymbol_const*,ska::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*,slang::Hasher<std::basic_string_view<char,std::char_traits<char>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*>>>>>
                      ();
  (this->packageExportCandidateMap).super_sherwood_v3_table<_b062436f_>.entries = psVar23;
  (this->packageExportCandidateMap).super_sherwood_v3_table<_b062436f_>.num_slots_minus_one = 0;
  (this->packageExportCandidateMap).super_sherwood_v3_table<_b062436f_>.hash_policy = '?';
  (this->packageExportCandidateMap).super_sherwood_v3_table<_b062436f_>.max_lookups = '\x03';
  (this->packageExportCandidateMap).super_sherwood_v3_table<_b062436f_>._max_load_factor = 0.5;
  (this->packageExportCandidateMap).super_sherwood_v3_table<_b062436f_>.num_elements = 0;
  (this->externInterfaceMethods).
  super__Vector_base<const_slang::ast::SubroutineSymbol_*,_std::allocator<const_slang::ast::SubroutineSymbol_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->externInterfaceMethods).
  super__Vector_base<const_slang::ast::SubroutineSymbol_*,_std::allocator<const_slang::ast::SubroutineSymbol_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->externInterfaceMethods).
  super__Vector_base<const_slang::ast::SubroutineSymbol_*,_std::allocator<const_slang::ast::SubroutineSymbol_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->nameConflicts).
  super__Vector_base<const_slang::ast::Symbol_*,_std::allocator<const_slang::ast::Symbol_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->nameConflicts).
  super__Vector_base<const_slang::ast::Symbol_*,_std::allocator<const_slang::ast::Symbol_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->nameConflicts).
  super__Vector_base<const_slang::ast::Symbol_*,_std::allocator<const_slang::ast::Symbol_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  psVar24 = ska::detailv3::
            empty_default_table<std::pair<slang::ast::Scope_const*,slang::ast::Symbol_const*>>();
  (this->defaultClockingMap).
  super_sherwood_v3_table<std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>,_const_slang::ast::Scope_*,_slang::Hasher<const_slang::ast::Scope_*>,_ska::detailv3::KeyOrValueHasher<const_slang::ast::Scope_*,_std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>,_slang::Hasher<const_slang::ast::Scope_*>_>,_std::equal_to<const_slang::ast::Scope_*>,_ska::detailv3::KeyOrValueEquality<const_slang::ast::Scope_*,_std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>_>_>_>
  .entries = psVar24;
  (this->defaultClockingMap).
  super_sherwood_v3_table<std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>,_const_slang::ast::Scope_*,_slang::Hasher<const_slang::ast::Scope_*>,_ska::detailv3::KeyOrValueHasher<const_slang::ast::Scope_*,_std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>,_slang::Hasher<const_slang::ast::Scope_*>_>,_std::equal_to<const_slang::ast::Scope_*>,_ska::detailv3::KeyOrValueEquality<const_slang::ast::Scope_*,_std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>_>_>_>
  .num_slots_minus_one = 0;
  (this->defaultClockingMap).
  super_sherwood_v3_table<std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>,_const_slang::ast::Scope_*,_slang::Hasher<const_slang::ast::Scope_*>,_ska::detailv3::KeyOrValueHasher<const_slang::ast::Scope_*,_std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>,_slang::Hasher<const_slang::ast::Scope_*>_>,_std::equal_to<const_slang::ast::Scope_*>,_ska::detailv3::KeyOrValueEquality<const_slang::ast::Scope_*,_std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>_>_>_>
  .hash_policy = '?';
  (this->defaultClockingMap).
  super_sherwood_v3_table<std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>,_const_slang::ast::Scope_*,_slang::Hasher<const_slang::ast::Scope_*>,_ska::detailv3::KeyOrValueHasher<const_slang::ast::Scope_*,_std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>,_slang::Hasher<const_slang::ast::Scope_*>_>,_std::equal_to<const_slang::ast::Scope_*>,_ska::detailv3::KeyOrValueEquality<const_slang::ast::Scope_*,_std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>_>_>_>
  .max_lookups = '\x03';
  (this->defaultClockingMap).
  super_sherwood_v3_table<std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>,_const_slang::ast::Scope_*,_slang::Hasher<const_slang::ast::Scope_*>,_ska::detailv3::KeyOrValueHasher<const_slang::ast::Scope_*,_std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>,_slang::Hasher<const_slang::ast::Scope_*>_>,_std::equal_to<const_slang::ast::Scope_*>,_ska::detailv3::KeyOrValueEquality<const_slang::ast::Scope_*,_std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>_>_>_>
  ._max_load_factor = 0.5;
  (this->defaultClockingMap).
  super_sherwood_v3_table<std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>,_const_slang::ast::Scope_*,_slang::Hasher<const_slang::ast::Scope_*>,_ska::detailv3::KeyOrValueHasher<const_slang::ast::Scope_*,_std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>,_slang::Hasher<const_slang::ast::Scope_*>_>,_std::equal_to<const_slang::ast::Scope_*>,_ska::detailv3::KeyOrValueEquality<const_slang::ast::Scope_*,_std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>_>_>_>
  .num_elements = 0;
  psVar24 = ska::detailv3::
            empty_default_table<std::pair<slang::ast::Scope_const*,slang::ast::Symbol_const*>>();
  (this->globalClockingMap).
  super_sherwood_v3_table<std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>,_const_slang::ast::Scope_*,_slang::Hasher<const_slang::ast::Scope_*>,_ska::detailv3::KeyOrValueHasher<const_slang::ast::Scope_*,_std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>,_slang::Hasher<const_slang::ast::Scope_*>_>,_std::equal_to<const_slang::ast::Scope_*>,_ska::detailv3::KeyOrValueEquality<const_slang::ast::Scope_*,_std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>_>_>_>
  .entries = psVar24;
  (this->globalClockingMap).
  super_sherwood_v3_table<std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>,_const_slang::ast::Scope_*,_slang::Hasher<const_slang::ast::Scope_*>,_ska::detailv3::KeyOrValueHasher<const_slang::ast::Scope_*,_std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>,_slang::Hasher<const_slang::ast::Scope_*>_>,_std::equal_to<const_slang::ast::Scope_*>,_ska::detailv3::KeyOrValueEquality<const_slang::ast::Scope_*,_std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>_>_>_>
  .num_slots_minus_one = 0;
  (this->globalClockingMap).
  super_sherwood_v3_table<std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>,_const_slang::ast::Scope_*,_slang::Hasher<const_slang::ast::Scope_*>,_ska::detailv3::KeyOrValueHasher<const_slang::ast::Scope_*,_std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>,_slang::Hasher<const_slang::ast::Scope_*>_>,_std::equal_to<const_slang::ast::Scope_*>,_ska::detailv3::KeyOrValueEquality<const_slang::ast::Scope_*,_std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>_>_>_>
  .hash_policy = '?';
  (this->globalClockingMap).
  super_sherwood_v3_table<std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>,_const_slang::ast::Scope_*,_slang::Hasher<const_slang::ast::Scope_*>,_ska::detailv3::KeyOrValueHasher<const_slang::ast::Scope_*,_std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>,_slang::Hasher<const_slang::ast::Scope_*>_>,_std::equal_to<const_slang::ast::Scope_*>,_ska::detailv3::KeyOrValueEquality<const_slang::ast::Scope_*,_std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>_>_>_>
  .max_lookups = '\x03';
  (this->globalClockingMap).
  super_sherwood_v3_table<std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>,_const_slang::ast::Scope_*,_slang::Hasher<const_slang::ast::Scope_*>,_ska::detailv3::KeyOrValueHasher<const_slang::ast::Scope_*,_std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>,_slang::Hasher<const_slang::ast::Scope_*>_>,_std::equal_to<const_slang::ast::Scope_*>,_ska::detailv3::KeyOrValueEquality<const_slang::ast::Scope_*,_std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>_>_>_>
  ._max_load_factor = 0.5;
  (this->globalClockingMap).
  super_sherwood_v3_table<std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>,_const_slang::ast::Scope_*,_slang::Hasher<const_slang::ast::Scope_*>,_ska::detailv3::KeyOrValueHasher<const_slang::ast::Scope_*,_std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>,_slang::Hasher<const_slang::ast::Scope_*>_>,_std::equal_to<const_slang::ast::Scope_*>,_ska::detailv3::KeyOrValueEquality<const_slang::ast::Scope_*,_std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>_>_>_>
  .num_elements = 0;
  psVar25 = ska::detailv3::
            empty_default_table<std::pair<slang::ast::Scope_const*,slang::ast::Expression_const*>>()
  ;
  (this->defaultDisableMap).
  super_sherwood_v3_table<std::pair<const_slang::ast::Scope_*,_const_slang::ast::Expression_*>,_const_slang::ast::Scope_*,_slang::Hasher<const_slang::ast::Scope_*>,_ska::detailv3::KeyOrValueHasher<const_slang::ast::Scope_*,_std::pair<const_slang::ast::Scope_*,_const_slang::ast::Expression_*>,_slang::Hasher<const_slang::ast::Scope_*>_>,_std::equal_to<const_slang::ast::Scope_*>,_ska::detailv3::KeyOrValueEquality<const_slang::ast::Scope_*,_std::pair<const_slang::ast::Scope_*,_const_slang::ast::Expression_*>,_std::equal_to<const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_slang::ast::Scope_*,_const_slang::ast::Expression_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<const_slang::ast::Scope_*,_const_slang::ast::Expression_*>_>_>_>
  .entries = psVar25;
  (this->defaultDisableMap).
  super_sherwood_v3_table<std::pair<const_slang::ast::Scope_*,_const_slang::ast::Expression_*>,_const_slang::ast::Scope_*,_slang::Hasher<const_slang::ast::Scope_*>,_ska::detailv3::KeyOrValueHasher<const_slang::ast::Scope_*,_std::pair<const_slang::ast::Scope_*,_const_slang::ast::Expression_*>,_slang::Hasher<const_slang::ast::Scope_*>_>,_std::equal_to<const_slang::ast::Scope_*>,_ska::detailv3::KeyOrValueEquality<const_slang::ast::Scope_*,_std::pair<const_slang::ast::Scope_*,_const_slang::ast::Expression_*>,_std::equal_to<const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_slang::ast::Scope_*,_const_slang::ast::Expression_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<const_slang::ast::Scope_*,_const_slang::ast::Expression_*>_>_>_>
  .num_slots_minus_one = 0;
  (this->defaultDisableMap).
  super_sherwood_v3_table<std::pair<const_slang::ast::Scope_*,_const_slang::ast::Expression_*>,_const_slang::ast::Scope_*,_slang::Hasher<const_slang::ast::Scope_*>,_ska::detailv3::KeyOrValueHasher<const_slang::ast::Scope_*,_std::pair<const_slang::ast::Scope_*,_const_slang::ast::Expression_*>,_slang::Hasher<const_slang::ast::Scope_*>_>,_std::equal_to<const_slang::ast::Scope_*>,_ska::detailv3::KeyOrValueEquality<const_slang::ast::Scope_*,_std::pair<const_slang::ast::Scope_*,_const_slang::ast::Expression_*>,_std::equal_to<const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_slang::ast::Scope_*,_const_slang::ast::Expression_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<const_slang::ast::Scope_*,_const_slang::ast::Expression_*>_>_>_>
  .hash_policy = '?';
  (this->defaultDisableMap).
  super_sherwood_v3_table<std::pair<const_slang::ast::Scope_*,_const_slang::ast::Expression_*>,_const_slang::ast::Scope_*,_slang::Hasher<const_slang::ast::Scope_*>,_ska::detailv3::KeyOrValueHasher<const_slang::ast::Scope_*,_std::pair<const_slang::ast::Scope_*,_const_slang::ast::Expression_*>,_slang::Hasher<const_slang::ast::Scope_*>_>,_std::equal_to<const_slang::ast::Scope_*>,_ska::detailv3::KeyOrValueEquality<const_slang::ast::Scope_*,_std::pair<const_slang::ast::Scope_*,_const_slang::ast::Expression_*>,_std::equal_to<const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_slang::ast::Scope_*,_const_slang::ast::Expression_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<const_slang::ast::Scope_*,_const_slang::ast::Expression_*>_>_>_>
  .max_lookups = '\x03';
  (this->defaultDisableMap).
  super_sherwood_v3_table<std::pair<const_slang::ast::Scope_*,_const_slang::ast::Expression_*>,_const_slang::ast::Scope_*,_slang::Hasher<const_slang::ast::Scope_*>,_ska::detailv3::KeyOrValueHasher<const_slang::ast::Scope_*,_std::pair<const_slang::ast::Scope_*,_const_slang::ast::Expression_*>,_slang::Hasher<const_slang::ast::Scope_*>_>,_std::equal_to<const_slang::ast::Scope_*>,_ska::detailv3::KeyOrValueEquality<const_slang::ast::Scope_*,_std::pair<const_slang::ast::Scope_*,_const_slang::ast::Expression_*>,_std::equal_to<const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_slang::ast::Scope_*,_const_slang::ast::Expression_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<const_slang::ast::Scope_*,_const_slang::ast::Expression_*>_>_>_>
  ._max_load_factor = 0.5;
  (this->defaultDisableMap).
  super_sherwood_v3_table<std::pair<const_slang::ast::Scope_*,_const_slang::ast::Expression_*>,_const_slang::ast::Scope_*,_slang::Hasher<const_slang::ast::Scope_*>,_ska::detailv3::KeyOrValueHasher<const_slang::ast::Scope_*,_std::pair<const_slang::ast::Scope_*,_const_slang::ast::Expression_*>,_slang::Hasher<const_slang::ast::Scope_*>_>,_std::equal_to<const_slang::ast::Scope_*>,_ska::detailv3::KeyOrValueEquality<const_slang::ast::Scope_*,_std::pair<const_slang::ast::Scope_*,_const_slang::ast::Expression_*>,_std::equal_to<const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_slang::ast::Scope_*,_const_slang::ast::Expression_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<const_slang::ast::Scope_*,_const_slang::ast::Expression_*>_>_>_>
  .num_elements = 0;
  (this->subroutineStorage).
  super__Vector_base<std::unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>,_std::allocator<std::unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->subroutineStorage).
  super__Vector_base<std::unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>,_std::allocator<std::unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->subroutineStorage).
  super__Vector_base<std::unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>,_std::allocator<std::unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->stdPkg = (PackageSymbol *)0x0;
  local_108[0]._M_head_impl._0_4_ = 0;
  pSVar26 = BumpAllocator::emplace<slang::ast::ScalarType,slang::ast::ScalarType::Kind>
                      (&this->super_BumpAllocator,(Kind *)local_108);
  this->bitType = (Type *)pSVar26;
  local_108[0]._M_head_impl._0_4_ = 1;
  pSVar26 = BumpAllocator::emplace<slang::ast::ScalarType,slang::ast::ScalarType::Kind>
                      (&this->super_BumpAllocator,(Kind *)local_108);
  this->logicType = (Type *)pSVar26;
  local_108[0]._M_head_impl._0_4_ = 1;
  pPVar27 = BumpAllocator::
            emplace<slang::ast::PredefinedIntegerType,slang::ast::PredefinedIntegerType::Kind>
                      (&this->super_BumpAllocator,(Kind *)local_108);
  this->intType = (Type *)pPVar27;
  local_108[0]._M_head_impl._0_4_ = 3;
  pPVar27 = BumpAllocator::
            emplace<slang::ast::PredefinedIntegerType,slang::ast::PredefinedIntegerType::Kind>
                      (&this->super_BumpAllocator,(Kind *)local_108);
  this->byteType = (Type *)pPVar27;
  local_108[0]._M_head_impl._0_4_ = 4;
  pPVar27 = BumpAllocator::
            emplace<slang::ast::PredefinedIntegerType,slang::ast::PredefinedIntegerType::Kind>
                      (&this->super_BumpAllocator,(Kind *)local_108);
  this->integerType = (Type *)pPVar27;
  local_108[0]._M_head_impl._0_4_ = 0;
  pFVar28 = BumpAllocator::emplace<slang::ast::FloatingType,slang::ast::FloatingType::Kind>
                      (&this->super_BumpAllocator,(Kind *)local_108);
  this->realType = &pFVar28->super_Type;
  local_108[0]._M_head_impl._0_4_ = 1;
  pFVar28 = BumpAllocator::emplace<slang::ast::FloatingType,slang::ast::FloatingType::Kind>
                      (&this->super_BumpAllocator,(Kind *)local_108);
  this->shortRealType = &pFVar28->super_Type;
  pTVar29 = &BumpAllocator::emplace<slang::ast::StringType>(&this->super_BumpAllocator)->super_Type;
  this->stringType = pTVar29;
  pTVar29 = &BumpAllocator::emplace<slang::ast::VoidType>(&this->super_BumpAllocator)->super_Type;
  this->voidType = pTVar29;
  pTVar29 = &BumpAllocator::emplace<slang::ast::ErrorType>(&this->super_BumpAllocator)->super_Type;
  this->errorType = pTVar29;
  local_108[0]._M_head_impl._0_4_ = 2;
  local_118 = BumpAllocator::emplace<slang::ast::ScalarType,slang::ast::ScalarType::Kind>
                        (&this->super_BumpAllocator,(Kind *)local_108);
  local_108[0]._M_head_impl._0_4_ = 0;
  local_119 = (convertible_to_value)0x1;
  local_e0 = BumpAllocator::emplace<slang::ast::ScalarType,slang::ast::ScalarType::Kind,bool>
                       (&this->super_BumpAllocator,(Kind *)local_108,(bool *)&local_119);
  local_108[0]._M_head_impl._0_4_ = 1;
  local_119 = (convertible_to_value)0x1;
  local_c0 = BumpAllocator::emplace<slang::ast::ScalarType,slang::ast::ScalarType::Kind,bool>
                       (&this->super_BumpAllocator,(Kind *)local_108,(bool *)&local_119);
  local_108[0]._M_head_impl._0_4_ = 2;
  local_119 = (convertible_to_value)0x1;
  local_c8 = BumpAllocator::emplace<slang::ast::ScalarType,slang::ast::ScalarType::Kind,bool>
                       (&this->super_BumpAllocator,(Kind *)local_108,(bool *)&local_119);
  local_108[0]._M_head_impl._0_4_ = 0;
  pPVar27 = BumpAllocator::
            emplace<slang::ast::PredefinedIntegerType,slang::ast::PredefinedIntegerType::Kind>
                      (&this->super_BumpAllocator,(Kind *)local_108);
  local_108[0]._M_head_impl._0_4_ = 2;
  pPVar30 = BumpAllocator::
            emplace<slang::ast::PredefinedIntegerType,slang::ast::PredefinedIntegerType::Kind>
                      (&this->super_BumpAllocator,(Kind *)local_108);
  local_108[0]._M_head_impl._0_4_ = 5;
  pPVar31 = BumpAllocator::
            emplace<slang::ast::PredefinedIntegerType,slang::ast::PredefinedIntegerType::Kind>
                      (&this->super_BumpAllocator,(Kind *)local_108);
  local_108[0]._M_head_impl._0_4_ = 2;
  pFVar28 = BumpAllocator::emplace<slang::ast::FloatingType,slang::ast::FloatingType::Kind>
                      (&this->super_BumpAllocator,(Kind *)local_108);
  local_48 = &BumpAllocator::emplace<slang::ast::CHandleType>(&this->super_BumpAllocator)->
              super_Type;
  local_50 = &BumpAllocator::emplace<slang::ast::NullType>(&this->super_BumpAllocator)->super_Type;
  local_58 = &BumpAllocator::emplace<slang::ast::EventType>(&this->super_BumpAllocator)->super_Type;
  local_60 = &BumpAllocator::emplace<slang::ast::UnboundedType>(&this->super_BumpAllocator)->
              super_Type;
  local_68 = &BumpAllocator::emplace<slang::ast::TypeRefType>(&this->super_BumpAllocator)->
              super_Type;
  local_70 = &BumpAllocator::emplace<slang::ast::UntypedType>(&this->super_BumpAllocator)->
              super_Type;
  local_78 = &BumpAllocator::emplace<slang::ast::SequenceType>(&this->super_BumpAllocator)->
              super_Type;
  local_80 = &BumpAllocator::emplace<slang::ast::PropertyType>(&this->super_BumpAllocator)->
              super_Type;
  local_108[0]._M_head_impl._0_4_ = 0x192;
  pVar34 = ska::detailv3::
           sherwood_v3_table<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>,slang::syntax::SyntaxKind,slang::Hasher<slang::syntax::SyntaxKind>,ska::detailv3::KeyOrValueHasher<slang::syntax::SyntaxKind,std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>,slang::Hasher<slang::syntax::SyntaxKind>>,std::equal_to<slang::syntax::SyntaxKind>,ska::detailv3::KeyOrValueEquality<slang::syntax::SyntaxKind,std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>,std::equal_to<slang::syntax::SyntaxKind>>,std::allocator<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>>>>
           ::
           emplace<slang::syntax::SyntaxKind,ska::flat_hash_map<slang::syntax::SyntaxKind,slang::ast::Type_const*,slang::Hasher<slang::syntax::SyntaxKind>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>>>::convertible_to_value>
                     ((sherwood_v3_table<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>,slang::syntax::SyntaxKind,slang::Hasher<slang::syntax::SyntaxKind>,ska::detailv3::KeyOrValueHasher<slang::syntax::SyntaxKind,std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>,slang::Hasher<slang::syntax::SyntaxKind>>,std::equal_to<slang::syntax::SyntaxKind>,ska::detailv3::KeyOrValueEquality<slang::syntax::SyntaxKind,std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>,std::equal_to<slang::syntax::SyntaxKind>>,std::allocator<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>>>>
                       *)this_00,(SyntaxKind *)local_108,&local_119);
  ((pVar34.first.current.current)->field_1).value.second = (Type *)pPVar27;
  pTVar29 = this->intType;
  local_108[0]._M_head_impl._0_4_ = 0xf1;
  pVar34 = ska::detailv3::
           sherwood_v3_table<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>,slang::syntax::SyntaxKind,slang::Hasher<slang::syntax::SyntaxKind>,ska::detailv3::KeyOrValueHasher<slang::syntax::SyntaxKind,std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>,slang::Hasher<slang::syntax::SyntaxKind>>,std::equal_to<slang::syntax::SyntaxKind>,ska::detailv3::KeyOrValueEquality<slang::syntax::SyntaxKind,std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>,std::equal_to<slang::syntax::SyntaxKind>>,std::allocator<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>>>>
           ::
           emplace<slang::syntax::SyntaxKind,ska::flat_hash_map<slang::syntax::SyntaxKind,slang::ast::Type_const*,slang::Hasher<slang::syntax::SyntaxKind>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>>>::convertible_to_value>
                     ((sherwood_v3_table<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>,slang::syntax::SyntaxKind,slang::Hasher<slang::syntax::SyntaxKind>,ska::detailv3::KeyOrValueHasher<slang::syntax::SyntaxKind,std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>,slang::Hasher<slang::syntax::SyntaxKind>>,std::equal_to<slang::syntax::SyntaxKind>,ska::detailv3::KeyOrValueEquality<slang::syntax::SyntaxKind,std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>,std::equal_to<slang::syntax::SyntaxKind>>,std::allocator<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>>>>
                       *)this_00,(SyntaxKind *)local_108,&local_119);
  ((pVar34.first.current.current)->field_1).value.second = pTVar29;
  local_108[0]._M_head_impl._0_4_ = 0x10b;
  pVar34 = ska::detailv3::
           sherwood_v3_table<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>,slang::syntax::SyntaxKind,slang::Hasher<slang::syntax::SyntaxKind>,ska::detailv3::KeyOrValueHasher<slang::syntax::SyntaxKind,std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>,slang::Hasher<slang::syntax::SyntaxKind>>,std::equal_to<slang::syntax::SyntaxKind>,ska::detailv3::KeyOrValueEquality<slang::syntax::SyntaxKind,std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>,std::equal_to<slang::syntax::SyntaxKind>>,std::allocator<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>>>>
           ::
           emplace<slang::syntax::SyntaxKind,ska::flat_hash_map<slang::syntax::SyntaxKind,slang::ast::Type_const*,slang::Hasher<slang::syntax::SyntaxKind>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>>>::convertible_to_value>
                     ((sherwood_v3_table<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>,slang::syntax::SyntaxKind,slang::Hasher<slang::syntax::SyntaxKind>,ska::detailv3::KeyOrValueHasher<slang::syntax::SyntaxKind,std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>,slang::Hasher<slang::syntax::SyntaxKind>>,std::equal_to<slang::syntax::SyntaxKind>,ska::detailv3::KeyOrValueEquality<slang::syntax::SyntaxKind,std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>,std::equal_to<slang::syntax::SyntaxKind>>,std::allocator<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>>>>
                       *)this_00,(SyntaxKind *)local_108,&local_119);
  ((pVar34.first.current.current)->field_1).value.second = (Type *)pPVar30;
  pTVar29 = this->byteType;
  local_108[0]._M_head_impl._0_4_ = 0x37;
  pVar34 = ska::detailv3::
           sherwood_v3_table<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>,slang::syntax::SyntaxKind,slang::Hasher<slang::syntax::SyntaxKind>,ska::detailv3::KeyOrValueHasher<slang::syntax::SyntaxKind,std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>,slang::Hasher<slang::syntax::SyntaxKind>>,std::equal_to<slang::syntax::SyntaxKind>,ska::detailv3::KeyOrValueEquality<slang::syntax::SyntaxKind,std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>,std::equal_to<slang::syntax::SyntaxKind>>,std::allocator<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>>>>
           ::
           emplace<slang::syntax::SyntaxKind,ska::flat_hash_map<slang::syntax::SyntaxKind,slang::ast::Type_const*,slang::Hasher<slang::syntax::SyntaxKind>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>>>::convertible_to_value>
                     ((sherwood_v3_table<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>,slang::syntax::SyntaxKind,slang::Hasher<slang::syntax::SyntaxKind>,ska::detailv3::KeyOrValueHasher<slang::syntax::SyntaxKind,std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>,slang::Hasher<slang::syntax::SyntaxKind>>,std::equal_to<slang::syntax::SyntaxKind>,ska::detailv3::KeyOrValueEquality<slang::syntax::SyntaxKind,std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>,std::equal_to<slang::syntax::SyntaxKind>>,std::allocator<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>>>>
                       *)this_00,(SyntaxKind *)local_108,&local_119);
  ((pVar34.first.current.current)->field_1).value.second = pTVar29;
  pTVar29 = this->bitType;
  local_108[0]._M_head_impl._0_4_ = 0x34;
  pVar34 = ska::detailv3::
           sherwood_v3_table<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>,slang::syntax::SyntaxKind,slang::Hasher<slang::syntax::SyntaxKind>,ska::detailv3::KeyOrValueHasher<slang::syntax::SyntaxKind,std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>,slang::Hasher<slang::syntax::SyntaxKind>>,std::equal_to<slang::syntax::SyntaxKind>,ska::detailv3::KeyOrValueEquality<slang::syntax::SyntaxKind,std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>,std::equal_to<slang::syntax::SyntaxKind>>,std::allocator<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>>>>
           ::
           emplace<slang::syntax::SyntaxKind,ska::flat_hash_map<slang::syntax::SyntaxKind,slang::ast::Type_const*,slang::Hasher<slang::syntax::SyntaxKind>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>>>::convertible_to_value>
                     ((sherwood_v3_table<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>,slang::syntax::SyntaxKind,slang::Hasher<slang::syntax::SyntaxKind>,ska::detailv3::KeyOrValueHasher<slang::syntax::SyntaxKind,std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>,slang::Hasher<slang::syntax::SyntaxKind>>,std::equal_to<slang::syntax::SyntaxKind>,ska::detailv3::KeyOrValueEquality<slang::syntax::SyntaxKind,std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>,std::equal_to<slang::syntax::SyntaxKind>>,std::allocator<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>>>>
                       *)this_00,(SyntaxKind *)local_108,&local_119);
  ((pVar34.first.current.current)->field_1).value.second = pTVar29;
  pTVar29 = this->logicType;
  local_108[0]._M_head_impl._0_4_ = 0x102;
  pVar34 = ska::detailv3::
           sherwood_v3_table<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>,slang::syntax::SyntaxKind,slang::Hasher<slang::syntax::SyntaxKind>,ska::detailv3::KeyOrValueHasher<slang::syntax::SyntaxKind,std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>,slang::Hasher<slang::syntax::SyntaxKind>>,std::equal_to<slang::syntax::SyntaxKind>,ska::detailv3::KeyOrValueEquality<slang::syntax::SyntaxKind,std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>,std::equal_to<slang::syntax::SyntaxKind>>,std::allocator<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>>>>
           ::
           emplace<slang::syntax::SyntaxKind,ska::flat_hash_map<slang::syntax::SyntaxKind,slang::ast::Type_const*,slang::Hasher<slang::syntax::SyntaxKind>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>>>::convertible_to_value>
                     ((sherwood_v3_table<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>,slang::syntax::SyntaxKind,slang::Hasher<slang::syntax::SyntaxKind>,ska::detailv3::KeyOrValueHasher<slang::syntax::SyntaxKind,std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>,slang::Hasher<slang::syntax::SyntaxKind>>,std::equal_to<slang::syntax::SyntaxKind>,ska::detailv3::KeyOrValueEquality<slang::syntax::SyntaxKind,std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>,std::equal_to<slang::syntax::SyntaxKind>>,std::allocator<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>>>>
                       *)this_00,(SyntaxKind *)local_108,&local_119);
  ((pVar34.first.current.current)->field_1).value.second = pTVar29;
  local_108[0]._M_head_impl._0_4_ = 0x17b;
  pVar34 = ska::detailv3::
           sherwood_v3_table<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>,slang::syntax::SyntaxKind,slang::Hasher<slang::syntax::SyntaxKind>,ska::detailv3::KeyOrValueHasher<slang::syntax::SyntaxKind,std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>,slang::Hasher<slang::syntax::SyntaxKind>>,std::equal_to<slang::syntax::SyntaxKind>,ska::detailv3::KeyOrValueEquality<slang::syntax::SyntaxKind,std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>,std::equal_to<slang::syntax::SyntaxKind>>,std::allocator<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>>>>
           ::
           emplace<slang::syntax::SyntaxKind,ska::flat_hash_map<slang::syntax::SyntaxKind,slang::ast::Type_const*,slang::Hasher<slang::syntax::SyntaxKind>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>>>::convertible_to_value>
                     ((sherwood_v3_table<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>,slang::syntax::SyntaxKind,slang::Hasher<slang::syntax::SyntaxKind>,ska::detailv3::KeyOrValueHasher<slang::syntax::SyntaxKind,std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>,slang::Hasher<slang::syntax::SyntaxKind>>,std::equal_to<slang::syntax::SyntaxKind>,ska::detailv3::KeyOrValueEquality<slang::syntax::SyntaxKind,std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>,std::equal_to<slang::syntax::SyntaxKind>>,std::allocator<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>>>>
                       *)this_00,(SyntaxKind *)local_108,&local_119);
  ((pVar34.first.current.current)->field_1).value.second = (Type *)local_118;
  pTVar29 = this->integerType;
  local_108[0]._M_head_impl._0_4_ = 0xf3;
  pVar34 = ska::detailv3::
           sherwood_v3_table<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>,slang::syntax::SyntaxKind,slang::Hasher<slang::syntax::SyntaxKind>,ska::detailv3::KeyOrValueHasher<slang::syntax::SyntaxKind,std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>,slang::Hasher<slang::syntax::SyntaxKind>>,std::equal_to<slang::syntax::SyntaxKind>,ska::detailv3::KeyOrValueEquality<slang::syntax::SyntaxKind,std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>,std::equal_to<slang::syntax::SyntaxKind>>,std::allocator<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>>>>
           ::
           emplace<slang::syntax::SyntaxKind,ska::flat_hash_map<slang::syntax::SyntaxKind,slang::ast::Type_const*,slang::Hasher<slang::syntax::SyntaxKind>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>>>::convertible_to_value>
                     ((sherwood_v3_table<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>,slang::syntax::SyntaxKind,slang::Hasher<slang::syntax::SyntaxKind>,ska::detailv3::KeyOrValueHasher<slang::syntax::SyntaxKind,std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>,slang::Hasher<slang::syntax::SyntaxKind>>,std::equal_to<slang::syntax::SyntaxKind>,ska::detailv3::KeyOrValueEquality<slang::syntax::SyntaxKind,std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>,std::equal_to<slang::syntax::SyntaxKind>>,std::allocator<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>>>>
                       *)this_00,(SyntaxKind *)local_108,&local_119);
  ((pVar34.first.current.current)->field_1).value.second = pTVar29;
  local_108[0]._M_head_impl._0_4_ = 0x1ba;
  pVar34 = ska::detailv3::
           sherwood_v3_table<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>,slang::syntax::SyntaxKind,slang::Hasher<slang::syntax::SyntaxKind>,ska::detailv3::KeyOrValueHasher<slang::syntax::SyntaxKind,std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>,slang::Hasher<slang::syntax::SyntaxKind>>,std::equal_to<slang::syntax::SyntaxKind>,ska::detailv3::KeyOrValueEquality<slang::syntax::SyntaxKind,std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>,std::equal_to<slang::syntax::SyntaxKind>>,std::allocator<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>>>>
           ::
           emplace<slang::syntax::SyntaxKind,ska::flat_hash_map<slang::syntax::SyntaxKind,slang::ast::Type_const*,slang::Hasher<slang::syntax::SyntaxKind>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>>>::convertible_to_value>
                     ((sherwood_v3_table<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>,slang::syntax::SyntaxKind,slang::Hasher<slang::syntax::SyntaxKind>,ska::detailv3::KeyOrValueHasher<slang::syntax::SyntaxKind,std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>,slang::Hasher<slang::syntax::SyntaxKind>>,std::equal_to<slang::syntax::SyntaxKind>,ska::detailv3::KeyOrValueEquality<slang::syntax::SyntaxKind,std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>,std::equal_to<slang::syntax::SyntaxKind>>,std::allocator<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>>>>
                       *)this_00,(SyntaxKind *)local_108,&local_119);
  ((pVar34.first.current.current)->field_1).value.second = (Type *)pPVar31;
  pTVar29 = this->realType;
  local_108[0]._M_head_impl._0_4_ = 0x17a;
  pVar34 = ska::detailv3::
           sherwood_v3_table<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>,slang::syntax::SyntaxKind,slang::Hasher<slang::syntax::SyntaxKind>,ska::detailv3::KeyOrValueHasher<slang::syntax::SyntaxKind,std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>,slang::Hasher<slang::syntax::SyntaxKind>>,std::equal_to<slang::syntax::SyntaxKind>,ska::detailv3::KeyOrValueEquality<slang::syntax::SyntaxKind,std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>,std::equal_to<slang::syntax::SyntaxKind>>,std::allocator<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>>>>
           ::
           emplace<slang::syntax::SyntaxKind,ska::flat_hash_map<slang::syntax::SyntaxKind,slang::ast::Type_const*,slang::Hasher<slang::syntax::SyntaxKind>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>>>::convertible_to_value>
                     ((sherwood_v3_table<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>,slang::syntax::SyntaxKind,slang::Hasher<slang::syntax::SyntaxKind>,ska::detailv3::KeyOrValueHasher<slang::syntax::SyntaxKind,std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>,slang::Hasher<slang::syntax::SyntaxKind>>,std::equal_to<slang::syntax::SyntaxKind>,ska::detailv3::KeyOrValueEquality<slang::syntax::SyntaxKind,std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>,std::equal_to<slang::syntax::SyntaxKind>>,std::allocator<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>>>>
                       *)this_00,(SyntaxKind *)local_108,&local_119);
  ((pVar34.first.current.current)->field_1).value.second = pTVar29;
  local_108[0]._M_head_impl._0_4_ = 0x179;
  pVar34 = ska::detailv3::
           sherwood_v3_table<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>,slang::syntax::SyntaxKind,slang::Hasher<slang::syntax::SyntaxKind>,ska::detailv3::KeyOrValueHasher<slang::syntax::SyntaxKind,std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>,slang::Hasher<slang::syntax::SyntaxKind>>,std::equal_to<slang::syntax::SyntaxKind>,ska::detailv3::KeyOrValueEquality<slang::syntax::SyntaxKind,std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>,std::equal_to<slang::syntax::SyntaxKind>>,std::allocator<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>>>>
           ::
           emplace<slang::syntax::SyntaxKind,ska::flat_hash_map<slang::syntax::SyntaxKind,slang::ast::Type_const*,slang::Hasher<slang::syntax::SyntaxKind>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>>>::convertible_to_value>
                     ((sherwood_v3_table<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>,slang::syntax::SyntaxKind,slang::Hasher<slang::syntax::SyntaxKind>,ska::detailv3::KeyOrValueHasher<slang::syntax::SyntaxKind,std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>,slang::Hasher<slang::syntax::SyntaxKind>>,std::equal_to<slang::syntax::SyntaxKind>,ska::detailv3::KeyOrValueEquality<slang::syntax::SyntaxKind,std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>,std::equal_to<slang::syntax::SyntaxKind>>,std::allocator<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>>>>
                       *)this_00,(SyntaxKind *)local_108,&local_119);
  ((pVar34.first.current.current)->field_1).value.second = &pFVar28->super_Type;
  pTVar29 = this->shortRealType;
  local_108[0]._M_head_impl._0_4_ = 0x193;
  pVar34 = ska::detailv3::
           sherwood_v3_table<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>,slang::syntax::SyntaxKind,slang::Hasher<slang::syntax::SyntaxKind>,ska::detailv3::KeyOrValueHasher<slang::syntax::SyntaxKind,std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>,slang::Hasher<slang::syntax::SyntaxKind>>,std::equal_to<slang::syntax::SyntaxKind>,ska::detailv3::KeyOrValueEquality<slang::syntax::SyntaxKind,std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>,std::equal_to<slang::syntax::SyntaxKind>>,std::allocator<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>>>>
           ::
           emplace<slang::syntax::SyntaxKind,ska::flat_hash_map<slang::syntax::SyntaxKind,slang::ast::Type_const*,slang::Hasher<slang::syntax::SyntaxKind>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>>>::convertible_to_value>
                     ((sherwood_v3_table<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>,slang::syntax::SyntaxKind,slang::Hasher<slang::syntax::SyntaxKind>,ska::detailv3::KeyOrValueHasher<slang::syntax::SyntaxKind,std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>,slang::Hasher<slang::syntax::SyntaxKind>>,std::equal_to<slang::syntax::SyntaxKind>,ska::detailv3::KeyOrValueEquality<slang::syntax::SyntaxKind,std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>,std::equal_to<slang::syntax::SyntaxKind>>,std::allocator<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>>>>
                       *)this_00,(SyntaxKind *)local_108,&local_119);
  ((pVar34.first.current.current)->field_1).value.second = pTVar29;
  pTVar29 = this->stringType;
  local_108[0]._M_head_impl._0_4_ = 0x1a8;
  pVar34 = ska::detailv3::
           sherwood_v3_table<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>,slang::syntax::SyntaxKind,slang::Hasher<slang::syntax::SyntaxKind>,ska::detailv3::KeyOrValueHasher<slang::syntax::SyntaxKind,std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>,slang::Hasher<slang::syntax::SyntaxKind>>,std::equal_to<slang::syntax::SyntaxKind>,ska::detailv3::KeyOrValueEquality<slang::syntax::SyntaxKind,std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>,std::equal_to<slang::syntax::SyntaxKind>>,std::allocator<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>>>>
           ::
           emplace<slang::syntax::SyntaxKind,ska::flat_hash_map<slang::syntax::SyntaxKind,slang::ast::Type_const*,slang::Hasher<slang::syntax::SyntaxKind>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>>>::convertible_to_value>
                     ((sherwood_v3_table<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>,slang::syntax::SyntaxKind,slang::Hasher<slang::syntax::SyntaxKind>,ska::detailv3::KeyOrValueHasher<slang::syntax::SyntaxKind,std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>,slang::Hasher<slang::syntax::SyntaxKind>>,std::equal_to<slang::syntax::SyntaxKind>,ska::detailv3::KeyOrValueEquality<slang::syntax::SyntaxKind,std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>,std::equal_to<slang::syntax::SyntaxKind>>,std::allocator<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>>>>
                       *)this_00,(SyntaxKind *)local_108,&local_119);
  ((pVar34.first.current.current)->field_1).value.second = pTVar29;
  local_108[0]._M_head_impl._0_4_ = 0x38;
  pVar34 = ska::detailv3::
           sherwood_v3_table<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>,slang::syntax::SyntaxKind,slang::Hasher<slang::syntax::SyntaxKind>,ska::detailv3::KeyOrValueHasher<slang::syntax::SyntaxKind,std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>,slang::Hasher<slang::syntax::SyntaxKind>>,std::equal_to<slang::syntax::SyntaxKind>,ska::detailv3::KeyOrValueEquality<slang::syntax::SyntaxKind,std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>,std::equal_to<slang::syntax::SyntaxKind>>,std::allocator<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>>>>
           ::
           emplace<slang::syntax::SyntaxKind,ska::flat_hash_map<slang::syntax::SyntaxKind,slang::ast::Type_const*,slang::Hasher<slang::syntax::SyntaxKind>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>>>::convertible_to_value>
                     ((sherwood_v3_table<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>,slang::syntax::SyntaxKind,slang::Hasher<slang::syntax::SyntaxKind>,ska::detailv3::KeyOrValueHasher<slang::syntax::SyntaxKind,std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>,slang::Hasher<slang::syntax::SyntaxKind>>,std::equal_to<slang::syntax::SyntaxKind>,ska::detailv3::KeyOrValueEquality<slang::syntax::SyntaxKind,std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>,std::equal_to<slang::syntax::SyntaxKind>>,std::allocator<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>>>>
                       *)this_00,(SyntaxKind *)local_108,&local_119);
  ((pVar34.first.current.current)->field_1).value.second = local_48;
  local_108[0]._M_head_impl._0_4_ = 0x13a;
  pVar34 = ska::detailv3::
           sherwood_v3_table<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>,slang::syntax::SyntaxKind,slang::Hasher<slang::syntax::SyntaxKind>,ska::detailv3::KeyOrValueHasher<slang::syntax::SyntaxKind,std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>,slang::Hasher<slang::syntax::SyntaxKind>>,std::equal_to<slang::syntax::SyntaxKind>,ska::detailv3::KeyOrValueEquality<slang::syntax::SyntaxKind,std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>,std::equal_to<slang::syntax::SyntaxKind>>,std::allocator<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>>>>
           ::
           emplace<slang::syntax::SyntaxKind,ska::flat_hash_map<slang::syntax::SyntaxKind,slang::ast::Type_const*,slang::Hasher<slang::syntax::SyntaxKind>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>>>::convertible_to_value>
                     ((sherwood_v3_table<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>,slang::syntax::SyntaxKind,slang::Hasher<slang::syntax::SyntaxKind>,ska::detailv3::KeyOrValueHasher<slang::syntax::SyntaxKind,std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>,slang::Hasher<slang::syntax::SyntaxKind>>,std::equal_to<slang::syntax::SyntaxKind>,ska::detailv3::KeyOrValueEquality<slang::syntax::SyntaxKind,std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>,std::equal_to<slang::syntax::SyntaxKind>>,std::allocator<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>>>>
                       *)this_00,(SyntaxKind *)local_108,&local_119);
  ((pVar34.first.current.current)->field_1).value.second = local_50;
  pTVar29 = this->voidType;
  local_108[0]._M_head_impl._0_4_ = 0x1ee;
  pVar34 = ska::detailv3::
           sherwood_v3_table<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>,slang::syntax::SyntaxKind,slang::Hasher<slang::syntax::SyntaxKind>,ska::detailv3::KeyOrValueHasher<slang::syntax::SyntaxKind,std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>,slang::Hasher<slang::syntax::SyntaxKind>>,std::equal_to<slang::syntax::SyntaxKind>,ska::detailv3::KeyOrValueEquality<slang::syntax::SyntaxKind,std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>,std::equal_to<slang::syntax::SyntaxKind>>,std::allocator<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>>>>
           ::
           emplace<slang::syntax::SyntaxKind,ska::flat_hash_map<slang::syntax::SyntaxKind,slang::ast::Type_const*,slang::Hasher<slang::syntax::SyntaxKind>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>>>::convertible_to_value>
                     ((sherwood_v3_table<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>,slang::syntax::SyntaxKind,slang::Hasher<slang::syntax::SyntaxKind>,ska::detailv3::KeyOrValueHasher<slang::syntax::SyntaxKind,std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>,slang::Hasher<slang::syntax::SyntaxKind>>,std::equal_to<slang::syntax::SyntaxKind>,ska::detailv3::KeyOrValueEquality<slang::syntax::SyntaxKind,std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>,std::equal_to<slang::syntax::SyntaxKind>>,std::allocator<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>>>>
                       *)this_00,(SyntaxKind *)local_108,&local_119);
  ((pVar34.first.current.current)->field_1).value.second = pTVar29;
  local_108[0]._M_head_impl._0_4_ = 0xb3;
  pVar34 = ska::detailv3::
           sherwood_v3_table<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>,slang::syntax::SyntaxKind,slang::Hasher<slang::syntax::SyntaxKind>,ska::detailv3::KeyOrValueHasher<slang::syntax::SyntaxKind,std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>,slang::Hasher<slang::syntax::SyntaxKind>>,std::equal_to<slang::syntax::SyntaxKind>,ska::detailv3::KeyOrValueEquality<slang::syntax::SyntaxKind,std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>,std::equal_to<slang::syntax::SyntaxKind>>,std::allocator<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>>>>
           ::
           emplace<slang::syntax::SyntaxKind,ska::flat_hash_map<slang::syntax::SyntaxKind,slang::ast::Type_const*,slang::Hasher<slang::syntax::SyntaxKind>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>>>::convertible_to_value>
                     ((sherwood_v3_table<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>,slang::syntax::SyntaxKind,slang::Hasher<slang::syntax::SyntaxKind>,ska::detailv3::KeyOrValueHasher<slang::syntax::SyntaxKind,std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>,slang::Hasher<slang::syntax::SyntaxKind>>,std::equal_to<slang::syntax::SyntaxKind>,ska::detailv3::KeyOrValueEquality<slang::syntax::SyntaxKind,std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>,std::equal_to<slang::syntax::SyntaxKind>>,std::allocator<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>>>>
                       *)this_00,(SyntaxKind *)local_108,&local_119);
  ((pVar34.first.current.current)->field_1).value.second = local_58;
  local_108[0]._M_head_impl._0_4_ = 0x1f5;
  pVar34 = ska::detailv3::
           sherwood_v3_table<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>,slang::syntax::SyntaxKind,slang::Hasher<slang::syntax::SyntaxKind>,ska::detailv3::KeyOrValueHasher<slang::syntax::SyntaxKind,std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>,slang::Hasher<slang::syntax::SyntaxKind>>,std::equal_to<slang::syntax::SyntaxKind>,ska::detailv3::KeyOrValueEquality<slang::syntax::SyntaxKind,std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>,std::equal_to<slang::syntax::SyntaxKind>>,std::allocator<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>>>>
           ::
           emplace<slang::syntax::SyntaxKind,ska::flat_hash_map<slang::syntax::SyntaxKind,slang::ast::Type_const*,slang::Hasher<slang::syntax::SyntaxKind>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>>>::convertible_to_value>
                     ((sherwood_v3_table<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>,slang::syntax::SyntaxKind,slang::Hasher<slang::syntax::SyntaxKind>,ska::detailv3::KeyOrValueHasher<slang::syntax::SyntaxKind,std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>,slang::Hasher<slang::syntax::SyntaxKind>>,std::equal_to<slang::syntax::SyntaxKind>,ska::detailv3::KeyOrValueEquality<slang::syntax::SyntaxKind,std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>,std::equal_to<slang::syntax::SyntaxKind>>,std::allocator<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>>>>
                       *)this_00,(SyntaxKind *)local_108,&local_119);
  ((pVar34.first.current.current)->field_1).value.second = local_60;
  local_108[0]._M_head_impl._0_4_ = 0x1c6;
  pVar34 = ska::detailv3::
           sherwood_v3_table<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>,slang::syntax::SyntaxKind,slang::Hasher<slang::syntax::SyntaxKind>,ska::detailv3::KeyOrValueHasher<slang::syntax::SyntaxKind,std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>,slang::Hasher<slang::syntax::SyntaxKind>>,std::equal_to<slang::syntax::SyntaxKind>,ska::detailv3::KeyOrValueEquality<slang::syntax::SyntaxKind,std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>,std::equal_to<slang::syntax::SyntaxKind>>,std::allocator<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>>>>
           ::
           emplace<slang::syntax::SyntaxKind,ska::flat_hash_map<slang::syntax::SyntaxKind,slang::ast::Type_const*,slang::Hasher<slang::syntax::SyntaxKind>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>>>::convertible_to_value>
                     ((sherwood_v3_table<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>,slang::syntax::SyntaxKind,slang::Hasher<slang::syntax::SyntaxKind>,ska::detailv3::KeyOrValueHasher<slang::syntax::SyntaxKind,std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>,slang::Hasher<slang::syntax::SyntaxKind>>,std::equal_to<slang::syntax::SyntaxKind>,ska::detailv3::KeyOrValueEquality<slang::syntax::SyntaxKind,std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>,std::equal_to<slang::syntax::SyntaxKind>>,std::allocator<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>>>>
                       *)this_00,(SyntaxKind *)local_108,&local_119);
  ((pVar34.first.current.current)->field_1).value.second = local_68;
  local_108[0]._M_head_impl._0_4_ = 0x1e7;
  pVar34 = ska::detailv3::
           sherwood_v3_table<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>,slang::syntax::SyntaxKind,slang::Hasher<slang::syntax::SyntaxKind>,ska::detailv3::KeyOrValueHasher<slang::syntax::SyntaxKind,std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>,slang::Hasher<slang::syntax::SyntaxKind>>,std::equal_to<slang::syntax::SyntaxKind>,ska::detailv3::KeyOrValueEquality<slang::syntax::SyntaxKind,std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>,std::equal_to<slang::syntax::SyntaxKind>>,std::allocator<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>>>>
           ::
           emplace<slang::syntax::SyntaxKind,ska::flat_hash_map<slang::syntax::SyntaxKind,slang::ast::Type_const*,slang::Hasher<slang::syntax::SyntaxKind>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>>>::convertible_to_value>
                     ((sherwood_v3_table<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>,slang::syntax::SyntaxKind,slang::Hasher<slang::syntax::SyntaxKind>,ska::detailv3::KeyOrValueHasher<slang::syntax::SyntaxKind,std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>,slang::Hasher<slang::syntax::SyntaxKind>>,std::equal_to<slang::syntax::SyntaxKind>,ska::detailv3::KeyOrValueEquality<slang::syntax::SyntaxKind,std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>,std::equal_to<slang::syntax::SyntaxKind>>,std::allocator<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>>>>
                       *)this_00,(SyntaxKind *)local_108,&local_119);
  ((pVar34.first.current.current)->field_1).value.second = local_70;
  local_108[0]._M_head_impl._0_4_ = 400;
  pVar34 = ska::detailv3::
           sherwood_v3_table<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>,slang::syntax::SyntaxKind,slang::Hasher<slang::syntax::SyntaxKind>,ska::detailv3::KeyOrValueHasher<slang::syntax::SyntaxKind,std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>,slang::Hasher<slang::syntax::SyntaxKind>>,std::equal_to<slang::syntax::SyntaxKind>,ska::detailv3::KeyOrValueEquality<slang::syntax::SyntaxKind,std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>,std::equal_to<slang::syntax::SyntaxKind>>,std::allocator<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>>>>
           ::
           emplace<slang::syntax::SyntaxKind,ska::flat_hash_map<slang::syntax::SyntaxKind,slang::ast::Type_const*,slang::Hasher<slang::syntax::SyntaxKind>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>>>::convertible_to_value>
                     ((sherwood_v3_table<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>,slang::syntax::SyntaxKind,slang::Hasher<slang::syntax::SyntaxKind>,ska::detailv3::KeyOrValueHasher<slang::syntax::SyntaxKind,std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>,slang::Hasher<slang::syntax::SyntaxKind>>,std::equal_to<slang::syntax::SyntaxKind>,ska::detailv3::KeyOrValueEquality<slang::syntax::SyntaxKind,std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>,std::equal_to<slang::syntax::SyntaxKind>>,std::allocator<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>>>>
                       *)this_00,(SyntaxKind *)local_108,&local_119);
  ((pVar34.first.current.current)->field_1).value.second = local_78;
  local_108[0]._M_head_impl._0_4_ = 0x16e;
  pVar34 = ska::detailv3::
           sherwood_v3_table<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>,slang::syntax::SyntaxKind,slang::Hasher<slang::syntax::SyntaxKind>,ska::detailv3::KeyOrValueHasher<slang::syntax::SyntaxKind,std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>,slang::Hasher<slang::syntax::SyntaxKind>>,std::equal_to<slang::syntax::SyntaxKind>,ska::detailv3::KeyOrValueEquality<slang::syntax::SyntaxKind,std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>,std::equal_to<slang::syntax::SyntaxKind>>,std::allocator<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>>>>
           ::
           emplace<slang::syntax::SyntaxKind,ska::flat_hash_map<slang::syntax::SyntaxKind,slang::ast::Type_const*,slang::Hasher<slang::syntax::SyntaxKind>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>>>::convertible_to_value>
                     ((sherwood_v3_table<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>,slang::syntax::SyntaxKind,slang::Hasher<slang::syntax::SyntaxKind>,ska::detailv3::KeyOrValueHasher<slang::syntax::SyntaxKind,std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>,slang::Hasher<slang::syntax::SyntaxKind>>,std::equal_to<slang::syntax::SyntaxKind>,ska::detailv3::KeyOrValueEquality<slang::syntax::SyntaxKind,std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>,std::equal_to<slang::syntax::SyntaxKind>>,std::allocator<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>>>>
                       *)this_00,(SyntaxKind *)local_108,&local_119);
  ((pVar34.first.current.current)->field_1).value.second = local_80;
  pTVar29 = this->errorType;
  local_108[0]._M_head_impl = (TypeArgFormatter *)((ulong)local_108[0]._M_head_impl._4_4_ << 0x20);
  pVar34 = ska::detailv3::
           sherwood_v3_table<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>,slang::syntax::SyntaxKind,slang::Hasher<slang::syntax::SyntaxKind>,ska::detailv3::KeyOrValueHasher<slang::syntax::SyntaxKind,std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>,slang::Hasher<slang::syntax::SyntaxKind>>,std::equal_to<slang::syntax::SyntaxKind>,ska::detailv3::KeyOrValueEquality<slang::syntax::SyntaxKind,std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>,std::equal_to<slang::syntax::SyntaxKind>>,std::allocator<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>>>>
           ::
           emplace<slang::syntax::SyntaxKind,ska::flat_hash_map<slang::syntax::SyntaxKind,slang::ast::Type_const*,slang::Hasher<slang::syntax::SyntaxKind>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>>>::convertible_to_value>
                     ((sherwood_v3_table<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>,slang::syntax::SyntaxKind,slang::Hasher<slang::syntax::SyntaxKind>,ska::detailv3::KeyOrValueHasher<slang::syntax::SyntaxKind,std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>,slang::Hasher<slang::syntax::SyntaxKind>>,std::equal_to<slang::syntax::SyntaxKind>,ska::detailv3::KeyOrValueEquality<slang::syntax::SyntaxKind,std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>,std::equal_to<slang::syntax::SyntaxKind>>,std::allocator<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::syntax::SyntaxKind,slang::ast::Type_const*>>>>
                       *)this_00,(SyntaxKind *)local_108,&local_119);
  ((pVar34.first.current.current)->field_1).value.second = pTVar29;
  sVar35 = parsing::LexerFacts::getTokenKindText(WireKeyword);
  pTVar29 = this->logicType;
  pNVar32 = (NetType *)operator_new(0x98);
  NetType::NetType(pNVar32,Wire,sVar35,pTVar29);
  local_108[0]._M_head_impl._0_2_ = 0x150;
  pVar36 = ska::detailv3::
           sherwood_v3_table<std::pair<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,slang::parsing::TokenKind,slang::Hasher<slang::parsing::TokenKind>,ska::detailv3::KeyOrValueHasher<slang::parsing::TokenKind,std::pair<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,slang::Hasher<slang::parsing::TokenKind>>,std::equal_to<slang::parsing::TokenKind>,ska::detailv3::KeyOrValueEquality<slang::parsing::TokenKind,std::pair<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,std::equal_to<slang::parsing::TokenKind>>,std::allocator<std::pair<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>>
           ::
           emplace<slang::parsing::TokenKind,ska::flat_hash_map<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>,slang::Hasher<slang::parsing::TokenKind>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>::convertible_to_value>
                     (local_110,(TokenKind *)local_108,(convertible_to_value *)&local_119);
  _Var1._M_head_impl =
       ((pVar36.first.current.current)->field_1).value.second._M_t.
       super___uniq_ptr_impl<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>._M_t.
       super__Tuple_impl<0UL,_slang::ast::NetType_*,_std::default_delete<slang::ast::NetType>_>.
       super__Head_base<0UL,_slang::ast::NetType_*,_false>._M_head_impl;
  *(NetType **)((long)&(pVar36.first.current.current)->field_1 + 8) = pNVar32;
  if (_Var1._M_head_impl != (NetType *)0x0) {
    operator_delete(_Var1._M_head_impl,0x98);
  }
  sVar35 = parsing::LexerFacts::getTokenKindText(WAndKeyword);
  pTVar29 = this->logicType;
  pNVar32 = (NetType *)operator_new(0x98);
  NetType::NetType(pNVar32,WAnd,sVar35,pTVar29);
  local_108[0]._M_head_impl._0_2_ = 0x14a;
  pVar36 = ska::detailv3::
           sherwood_v3_table<std::pair<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,slang::parsing::TokenKind,slang::Hasher<slang::parsing::TokenKind>,ska::detailv3::KeyOrValueHasher<slang::parsing::TokenKind,std::pair<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,slang::Hasher<slang::parsing::TokenKind>>,std::equal_to<slang::parsing::TokenKind>,ska::detailv3::KeyOrValueEquality<slang::parsing::TokenKind,std::pair<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,std::equal_to<slang::parsing::TokenKind>>,std::allocator<std::pair<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>>
           ::
           emplace<slang::parsing::TokenKind,ska::flat_hash_map<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>,slang::Hasher<slang::parsing::TokenKind>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>::convertible_to_value>
                     (local_110,(TokenKind *)local_108,(convertible_to_value *)&local_119);
  _Var1._M_head_impl =
       ((pVar36.first.current.current)->field_1).value.second._M_t.
       super___uniq_ptr_impl<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>._M_t.
       super__Tuple_impl<0UL,_slang::ast::NetType_*,_std::default_delete<slang::ast::NetType>_>.
       super__Head_base<0UL,_slang::ast::NetType_*,_false>._M_head_impl;
  *(NetType **)((long)&(pVar36.first.current.current)->field_1 + 8) = pNVar32;
  if (_Var1._M_head_impl != (NetType *)0x0) {
    operator_delete(_Var1._M_head_impl,0x98);
  }
  sVar35 = parsing::LexerFacts::getTokenKindText(WOrKeyword);
  pTVar29 = this->logicType;
  pNVar32 = (NetType *)operator_new(0x98);
  NetType::NetType(pNVar32,WOr,sVar35,pTVar29);
  local_108[0]._M_head_impl._0_2_ = 0x153;
  pVar36 = ska::detailv3::
           sherwood_v3_table<std::pair<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,slang::parsing::TokenKind,slang::Hasher<slang::parsing::TokenKind>,ska::detailv3::KeyOrValueHasher<slang::parsing::TokenKind,std::pair<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,slang::Hasher<slang::parsing::TokenKind>>,std::equal_to<slang::parsing::TokenKind>,ska::detailv3::KeyOrValueEquality<slang::parsing::TokenKind,std::pair<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,std::equal_to<slang::parsing::TokenKind>>,std::allocator<std::pair<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>>
           ::
           emplace<slang::parsing::TokenKind,ska::flat_hash_map<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>,slang::Hasher<slang::parsing::TokenKind>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>::convertible_to_value>
                     (local_110,(TokenKind *)local_108,(convertible_to_value *)&local_119);
  _Var1._M_head_impl =
       ((pVar36.first.current.current)->field_1).value.second._M_t.
       super___uniq_ptr_impl<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>._M_t.
       super__Tuple_impl<0UL,_slang::ast::NetType_*,_std::default_delete<slang::ast::NetType>_>.
       super__Head_base<0UL,_slang::ast::NetType_*,_false>._M_head_impl;
  *(NetType **)((long)&(pVar36.first.current.current)->field_1 + 8) = pNVar32;
  if (_Var1._M_head_impl != (NetType *)0x0) {
    operator_delete(_Var1._M_head_impl,0x98);
  }
  sVar35 = parsing::LexerFacts::getTokenKindText(TriKeyword);
  pTVar29 = this->logicType;
  pNVar32 = (NetType *)operator_new(0x98);
  NetType::NetType(pNVar32,Tri,sVar35,pTVar29);
  local_108[0]._M_head_impl._0_2_ = 0x133;
  pVar36 = ska::detailv3::
           sherwood_v3_table<std::pair<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,slang::parsing::TokenKind,slang::Hasher<slang::parsing::TokenKind>,ska::detailv3::KeyOrValueHasher<slang::parsing::TokenKind,std::pair<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,slang::Hasher<slang::parsing::TokenKind>>,std::equal_to<slang::parsing::TokenKind>,ska::detailv3::KeyOrValueEquality<slang::parsing::TokenKind,std::pair<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,std::equal_to<slang::parsing::TokenKind>>,std::allocator<std::pair<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>>
           ::
           emplace<slang::parsing::TokenKind,ska::flat_hash_map<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>,slang::Hasher<slang::parsing::TokenKind>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>::convertible_to_value>
                     (local_110,(TokenKind *)local_108,(convertible_to_value *)&local_119);
  _Var1._M_head_impl =
       ((pVar36.first.current.current)->field_1).value.second._M_t.
       super___uniq_ptr_impl<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>._M_t.
       super__Tuple_impl<0UL,_slang::ast::NetType_*,_std::default_delete<slang::ast::NetType>_>.
       super__Head_base<0UL,_slang::ast::NetType_*,_false>._M_head_impl;
  *(NetType **)((long)&(pVar36.first.current.current)->field_1 + 8) = pNVar32;
  if (_Var1._M_head_impl != (NetType *)0x0) {
    operator_delete(_Var1._M_head_impl,0x98);
  }
  sVar35 = parsing::LexerFacts::getTokenKindText(TriAndKeyword);
  pTVar29 = this->logicType;
  pNVar32 = (NetType *)operator_new(0x98);
  NetType::NetType(pNVar32,TriAnd,sVar35,pTVar29);
  local_108[0]._M_head_impl._0_2_ = 0x136;
  pVar36 = ska::detailv3::
           sherwood_v3_table<std::pair<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,slang::parsing::TokenKind,slang::Hasher<slang::parsing::TokenKind>,ska::detailv3::KeyOrValueHasher<slang::parsing::TokenKind,std::pair<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,slang::Hasher<slang::parsing::TokenKind>>,std::equal_to<slang::parsing::TokenKind>,ska::detailv3::KeyOrValueEquality<slang::parsing::TokenKind,std::pair<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,std::equal_to<slang::parsing::TokenKind>>,std::allocator<std::pair<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>>
           ::
           emplace<slang::parsing::TokenKind,ska::flat_hash_map<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>,slang::Hasher<slang::parsing::TokenKind>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>::convertible_to_value>
                     (local_110,(TokenKind *)local_108,(convertible_to_value *)&local_119);
  _Var1._M_head_impl =
       ((pVar36.first.current.current)->field_1).value.second._M_t.
       super___uniq_ptr_impl<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>._M_t.
       super__Tuple_impl<0UL,_slang::ast::NetType_*,_std::default_delete<slang::ast::NetType>_>.
       super__Head_base<0UL,_slang::ast::NetType_*,_false>._M_head_impl;
  *(NetType **)((long)&(pVar36.first.current.current)->field_1 + 8) = pNVar32;
  if (_Var1._M_head_impl != (NetType *)0x0) {
    operator_delete(_Var1._M_head_impl,0x98);
  }
  sVar35 = parsing::LexerFacts::getTokenKindText(TriOrKeyword);
  pTVar29 = this->logicType;
  pNVar32 = (NetType *)operator_new(0x98);
  NetType::NetType(pNVar32,TriOr,sVar35,pTVar29);
  local_108[0]._M_head_impl._0_2_ = 0x137;
  pVar36 = ska::detailv3::
           sherwood_v3_table<std::pair<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,slang::parsing::TokenKind,slang::Hasher<slang::parsing::TokenKind>,ska::detailv3::KeyOrValueHasher<slang::parsing::TokenKind,std::pair<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,slang::Hasher<slang::parsing::TokenKind>>,std::equal_to<slang::parsing::TokenKind>,ska::detailv3::KeyOrValueEquality<slang::parsing::TokenKind,std::pair<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,std::equal_to<slang::parsing::TokenKind>>,std::allocator<std::pair<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>>
           ::
           emplace<slang::parsing::TokenKind,ska::flat_hash_map<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>,slang::Hasher<slang::parsing::TokenKind>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>::convertible_to_value>
                     (local_110,(TokenKind *)local_108,(convertible_to_value *)&local_119);
  _Var1._M_head_impl =
       ((pVar36.first.current.current)->field_1).value.second._M_t.
       super___uniq_ptr_impl<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>._M_t.
       super__Tuple_impl<0UL,_slang::ast::NetType_*,_std::default_delete<slang::ast::NetType>_>.
       super__Head_base<0UL,_slang::ast::NetType_*,_false>._M_head_impl;
  *(NetType **)((long)&(pVar36.first.current.current)->field_1 + 8) = pNVar32;
  if (_Var1._M_head_impl != (NetType *)0x0) {
    operator_delete(_Var1._M_head_impl,0x98);
  }
  sVar35 = parsing::LexerFacts::getTokenKindText(Tri0Keyword);
  pTVar29 = this->logicType;
  pNVar32 = (NetType *)operator_new(0x98);
  NetType::NetType(pNVar32,Tri0,sVar35,pTVar29);
  local_108[0]._M_head_impl._0_2_ = 0x134;
  pVar36 = ska::detailv3::
           sherwood_v3_table<std::pair<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,slang::parsing::TokenKind,slang::Hasher<slang::parsing::TokenKind>,ska::detailv3::KeyOrValueHasher<slang::parsing::TokenKind,std::pair<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,slang::Hasher<slang::parsing::TokenKind>>,std::equal_to<slang::parsing::TokenKind>,ska::detailv3::KeyOrValueEquality<slang::parsing::TokenKind,std::pair<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,std::equal_to<slang::parsing::TokenKind>>,std::allocator<std::pair<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>>
           ::
           emplace<slang::parsing::TokenKind,ska::flat_hash_map<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>,slang::Hasher<slang::parsing::TokenKind>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>::convertible_to_value>
                     (local_110,(TokenKind *)local_108,(convertible_to_value *)&local_119);
  _Var1._M_head_impl =
       ((pVar36.first.current.current)->field_1).value.second._M_t.
       super___uniq_ptr_impl<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>._M_t.
       super__Tuple_impl<0UL,_slang::ast::NetType_*,_std::default_delete<slang::ast::NetType>_>.
       super__Head_base<0UL,_slang::ast::NetType_*,_false>._M_head_impl;
  *(NetType **)((long)&(pVar36.first.current.current)->field_1 + 8) = pNVar32;
  if (_Var1._M_head_impl != (NetType *)0x0) {
    operator_delete(_Var1._M_head_impl,0x98);
  }
  sVar35 = parsing::LexerFacts::getTokenKindText(Tri1Keyword);
  pTVar29 = this->logicType;
  pNVar32 = (NetType *)operator_new(0x98);
  NetType::NetType(pNVar32,Tri1,sVar35,pTVar29);
  local_108[0]._M_head_impl._0_2_ = 0x135;
  pVar36 = ska::detailv3::
           sherwood_v3_table<std::pair<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,slang::parsing::TokenKind,slang::Hasher<slang::parsing::TokenKind>,ska::detailv3::KeyOrValueHasher<slang::parsing::TokenKind,std::pair<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,slang::Hasher<slang::parsing::TokenKind>>,std::equal_to<slang::parsing::TokenKind>,ska::detailv3::KeyOrValueEquality<slang::parsing::TokenKind,std::pair<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,std::equal_to<slang::parsing::TokenKind>>,std::allocator<std::pair<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>>
           ::
           emplace<slang::parsing::TokenKind,ska::flat_hash_map<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>,slang::Hasher<slang::parsing::TokenKind>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>::convertible_to_value>
                     (local_110,(TokenKind *)local_108,(convertible_to_value *)&local_119);
  _Var1._M_head_impl =
       ((pVar36.first.current.current)->field_1).value.second._M_t.
       super___uniq_ptr_impl<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>._M_t.
       super__Tuple_impl<0UL,_slang::ast::NetType_*,_std::default_delete<slang::ast::NetType>_>.
       super__Head_base<0UL,_slang::ast::NetType_*,_false>._M_head_impl;
  *(NetType **)((long)&(pVar36.first.current.current)->field_1 + 8) = pNVar32;
  if (_Var1._M_head_impl != (NetType *)0x0) {
    operator_delete(_Var1._M_head_impl,0x98);
  }
  sVar35 = parsing::LexerFacts::getTokenKindText(TriRegKeyword);
  pTVar29 = this->logicType;
  pNVar32 = (NetType *)operator_new(0x98);
  NetType::NetType(pNVar32,TriReg,sVar35,pTVar29);
  local_108[0]._M_head_impl._0_2_ = 0x138;
  pVar36 = ska::detailv3::
           sherwood_v3_table<std::pair<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,slang::parsing::TokenKind,slang::Hasher<slang::parsing::TokenKind>,ska::detailv3::KeyOrValueHasher<slang::parsing::TokenKind,std::pair<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,slang::Hasher<slang::parsing::TokenKind>>,std::equal_to<slang::parsing::TokenKind>,ska::detailv3::KeyOrValueEquality<slang::parsing::TokenKind,std::pair<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,std::equal_to<slang::parsing::TokenKind>>,std::allocator<std::pair<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>>
           ::
           emplace<slang::parsing::TokenKind,ska::flat_hash_map<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>,slang::Hasher<slang::parsing::TokenKind>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>::convertible_to_value>
                     (local_110,(TokenKind *)local_108,(convertible_to_value *)&local_119);
  _Var1._M_head_impl =
       ((pVar36.first.current.current)->field_1).value.second._M_t.
       super___uniq_ptr_impl<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>._M_t.
       super__Tuple_impl<0UL,_slang::ast::NetType_*,_std::default_delete<slang::ast::NetType>_>.
       super__Head_base<0UL,_slang::ast::NetType_*,_false>._M_head_impl;
  *(NetType **)((long)&(pVar36.first.current.current)->field_1 + 8) = pNVar32;
  if (_Var1._M_head_impl != (NetType *)0x0) {
    operator_delete(_Var1._M_head_impl,0x98);
  }
  sVar35 = parsing::LexerFacts::getTokenKindText(Supply0Keyword);
  pTVar29 = this->logicType;
  pNVar32 = (NetType *)operator_new(0x98);
  NetType::NetType(pNVar32,Supply0,sVar35,pTVar29);
  local_108[0]._M_head_impl._0_2_ = 0x124;
  pVar36 = ska::detailv3::
           sherwood_v3_table<std::pair<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,slang::parsing::TokenKind,slang::Hasher<slang::parsing::TokenKind>,ska::detailv3::KeyOrValueHasher<slang::parsing::TokenKind,std::pair<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,slang::Hasher<slang::parsing::TokenKind>>,std::equal_to<slang::parsing::TokenKind>,ska::detailv3::KeyOrValueEquality<slang::parsing::TokenKind,std::pair<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,std::equal_to<slang::parsing::TokenKind>>,std::allocator<std::pair<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>>
           ::
           emplace<slang::parsing::TokenKind,ska::flat_hash_map<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>,slang::Hasher<slang::parsing::TokenKind>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>::convertible_to_value>
                     (local_110,(TokenKind *)local_108,(convertible_to_value *)&local_119);
  _Var1._M_head_impl =
       ((pVar36.first.current.current)->field_1).value.second._M_t.
       super___uniq_ptr_impl<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>._M_t.
       super__Tuple_impl<0UL,_slang::ast::NetType_*,_std::default_delete<slang::ast::NetType>_>.
       super__Head_base<0UL,_slang::ast::NetType_*,_false>._M_head_impl;
  *(NetType **)((long)&(pVar36.first.current.current)->field_1 + 8) = pNVar32;
  if (_Var1._M_head_impl != (NetType *)0x0) {
    operator_delete(_Var1._M_head_impl,0x98);
  }
  sVar35 = parsing::LexerFacts::getTokenKindText(Supply1Keyword);
  pTVar29 = this->logicType;
  pNVar32 = (NetType *)operator_new(0x98);
  NetType::NetType(pNVar32,Supply1,sVar35,pTVar29);
  local_108[0]._M_head_impl._0_2_ = 0x125;
  pVar36 = ska::detailv3::
           sherwood_v3_table<std::pair<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,slang::parsing::TokenKind,slang::Hasher<slang::parsing::TokenKind>,ska::detailv3::KeyOrValueHasher<slang::parsing::TokenKind,std::pair<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,slang::Hasher<slang::parsing::TokenKind>>,std::equal_to<slang::parsing::TokenKind>,ska::detailv3::KeyOrValueEquality<slang::parsing::TokenKind,std::pair<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,std::equal_to<slang::parsing::TokenKind>>,std::allocator<std::pair<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>>
           ::
           emplace<slang::parsing::TokenKind,ska::flat_hash_map<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>,slang::Hasher<slang::parsing::TokenKind>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>::convertible_to_value>
                     (local_110,(TokenKind *)local_108,(convertible_to_value *)&local_119);
  _Var1._M_head_impl =
       ((pVar36.first.current.current)->field_1).value.second._M_t.
       super___uniq_ptr_impl<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>._M_t.
       super__Tuple_impl<0UL,_slang::ast::NetType_*,_std::default_delete<slang::ast::NetType>_>.
       super__Head_base<0UL,_slang::ast::NetType_*,_false>._M_head_impl;
  *(NetType **)((long)&(pVar36.first.current.current)->field_1 + 8) = pNVar32;
  if (_Var1._M_head_impl != (NetType *)0x0) {
    operator_delete(_Var1._M_head_impl,0x98);
  }
  sVar35 = parsing::LexerFacts::getTokenKindText(UWireKeyword);
  pTVar29 = this->logicType;
  pNVar32 = (NetType *)operator_new(0x98);
  NetType::NetType(pNVar32,UWire,sVar35,pTVar29);
  local_108[0]._M_head_impl._0_2_ = 0x143;
  pVar36 = ska::detailv3::
           sherwood_v3_table<std::pair<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,slang::parsing::TokenKind,slang::Hasher<slang::parsing::TokenKind>,ska::detailv3::KeyOrValueHasher<slang::parsing::TokenKind,std::pair<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,slang::Hasher<slang::parsing::TokenKind>>,std::equal_to<slang::parsing::TokenKind>,ska::detailv3::KeyOrValueEquality<slang::parsing::TokenKind,std::pair<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,std::equal_to<slang::parsing::TokenKind>>,std::allocator<std::pair<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>>
           ::
           emplace<slang::parsing::TokenKind,ska::flat_hash_map<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>,slang::Hasher<slang::parsing::TokenKind>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>::convertible_to_value>
                     (local_110,(TokenKind *)local_108,(convertible_to_value *)&local_119);
  _Var1._M_head_impl =
       ((pVar36.first.current.current)->field_1).value.second._M_t.
       super___uniq_ptr_impl<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>._M_t.
       super__Tuple_impl<0UL,_slang::ast::NetType_*,_std::default_delete<slang::ast::NetType>_>.
       super__Head_base<0UL,_slang::ast::NetType_*,_false>._M_head_impl;
  *(NetType **)((long)&(pVar36.first.current.current)->field_1 + 8) = pNVar32;
  if (_Var1._M_head_impl != (NetType *)0x0) {
    operator_delete(_Var1._M_head_impl,0x98);
  }
  sVar35 = parsing::LexerFacts::getTokenKindText(InterconnectKeyword);
  pTVar29 = this->logicType;
  pNVar32 = (NetType *)operator_new(0x98);
  NetType::NetType(pNVar32,Interconnect,sVar35,pTVar29);
  local_108[0]._M_head_impl._0_2_ = 200;
  pVar36 = ska::detailv3::
           sherwood_v3_table<std::pair<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,slang::parsing::TokenKind,slang::Hasher<slang::parsing::TokenKind>,ska::detailv3::KeyOrValueHasher<slang::parsing::TokenKind,std::pair<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,slang::Hasher<slang::parsing::TokenKind>>,std::equal_to<slang::parsing::TokenKind>,ska::detailv3::KeyOrValueEquality<slang::parsing::TokenKind,std::pair<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,std::equal_to<slang::parsing::TokenKind>>,std::allocator<std::pair<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>>
           ::
           emplace<slang::parsing::TokenKind,ska::flat_hash_map<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>,slang::Hasher<slang::parsing::TokenKind>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>::convertible_to_value>
                     (local_110,(TokenKind *)local_108,(convertible_to_value *)&local_119);
  _Var1._M_head_impl =
       ((pVar36.first.current.current)->field_1).value.second._M_t.
       super___uniq_ptr_impl<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>._M_t.
       super__Tuple_impl<0UL,_slang::ast::NetType_*,_std::default_delete<slang::ast::NetType>_>.
       super__Head_base<0UL,_slang::ast::NetType_*,_false>._M_head_impl;
  *(NetType **)((long)&(pVar36.first.current.current)->field_1 + 8) = pNVar32;
  if (_Var1._M_head_impl != (NetType *)0x0) {
    operator_delete(_Var1._M_head_impl,0x98);
  }
  pTVar29 = this->logicType;
  pNVar32 = (NetType *)operator_new(0x98);
  sVar35._M_str = "<error>";
  sVar35._M_len = 7;
  NetType::NetType(pNVar32,Unknown,sVar35,pTVar29);
  local_108[0]._M_head_impl = local_108[0]._M_head_impl & 0xffffffffffff0000;
  pVar36 = ska::detailv3::
           sherwood_v3_table<std::pair<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,slang::parsing::TokenKind,slang::Hasher<slang::parsing::TokenKind>,ska::detailv3::KeyOrValueHasher<slang::parsing::TokenKind,std::pair<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,slang::Hasher<slang::parsing::TokenKind>>,std::equal_to<slang::parsing::TokenKind>,ska::detailv3::KeyOrValueEquality<slang::parsing::TokenKind,std::pair<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,std::equal_to<slang::parsing::TokenKind>>,std::allocator<std::pair<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>>
           ::
           emplace<slang::parsing::TokenKind,ska::flat_hash_map<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>,slang::Hasher<slang::parsing::TokenKind>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>::convertible_to_value>
                     (local_110,(TokenKind *)local_108,(convertible_to_value *)&local_119);
  _Var1._M_head_impl =
       ((pVar36.first.current.current)->field_1).value.second._M_t.
       super___uniq_ptr_impl<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>._M_t.
       super__Tuple_impl<0UL,_slang::ast::NetType_*,_std::default_delete<slang::ast::NetType>_>.
       super__Head_base<0UL,_slang::ast::NetType_*,_false>._M_head_impl;
  *(NetType **)((long)&(pVar36.first.current.current)->field_1 + 8) = pNVar32;
  if (_Var1._M_head_impl != (NetType *)0x0) {
    operator_delete(_Var1._M_head_impl,0x98);
  }
  local_108[0]._M_head_impl._0_2_ = 0x150;
  pVar36 = ska::detailv3::
           sherwood_v3_table<std::pair<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,slang::parsing::TokenKind,slang::Hasher<slang::parsing::TokenKind>,ska::detailv3::KeyOrValueHasher<slang::parsing::TokenKind,std::pair<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,slang::Hasher<slang::parsing::TokenKind>>,std::equal_to<slang::parsing::TokenKind>,ska::detailv3::KeyOrValueEquality<slang::parsing::TokenKind,std::pair<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,std::equal_to<slang::parsing::TokenKind>>,std::allocator<std::pair<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>>
           ::
           emplace<slang::parsing::TokenKind,ska::flat_hash_map<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>,slang::Hasher<slang::parsing::TokenKind>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>::convertible_to_value>
                     (local_110,(TokenKind *)local_108,(convertible_to_value *)&local_119);
  this->wireNetType =
       ((pVar36.first.current.current)->field_1).value.second._M_t.
       super___uniq_ptr_impl<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>._M_t.
       super__Tuple_impl<0UL,_slang::ast::NetType_*,_std::default_delete<slang::ast::NetType>_>.
       super__Head_base<0UL,_slang::ast::NetType_*,_false>._M_head_impl;
  pTVar29 = this->bitType;
  bVar4 = Type::getIntegralFlags(pTVar29);
  this->scalarTypeTable[bVar4.m_bits & 7] = pTVar29;
  pTVar29 = this->logicType;
  bVar4 = Type::getIntegralFlags(pTVar29);
  this->scalarTypeTable[bVar4.m_bits & 7] = pTVar29;
  bVar4 = Type::getIntegralFlags((Type *)local_118);
  this->scalarTypeTable[bVar4.m_bits & 7] = (Type *)local_118;
  bVar4 = Type::getIntegralFlags((Type *)local_e0);
  this->scalarTypeTable[bVar4.m_bits & 7] = (Type *)local_e0;
  bVar4 = Type::getIntegralFlags((Type *)local_c0);
  this->scalarTypeTable[bVar4.m_bits & 7] = (Type *)local_c0;
  bVar4 = Type::getIntegralFlags((Type *)local_c8);
  this->scalarTypeTable[bVar4.m_bits & 7] = (Type *)local_c8;
  (this->defaultTimeScale).base.unit = Nanoseconds;
  (this->defaultTimeScale).base.magnitude = One;
  (this->defaultTimeScale).precision.unit = Nanoseconds;
  (this->defaultTimeScale).precision.magnitude = One;
  thisSym_ = (RootSymbol *)operator_new(0x90);
  (thisSym_->super_Symbol).kind = Root;
  (thisSym_->super_Symbol).name._M_len = 5;
  (thisSym_->super_Symbol).name._M_str = "$root";
  (thisSym_->super_Symbol).originatingSyntax = (SyntaxNode *)0x0;
  (thisSym_->super_Symbol).location = (SourceLocation)0x0;
  (thisSym_->super_Symbol).parentScope = (Scope *)0x0;
  *(undefined8 *)((long)&(thisSym_->super_Symbol).parentScope + 4) = 0;
  *(undefined8 *)((long)&(thisSym_->super_Symbol).nextInScope + 4) = 0;
  Scope::Scope(&thisSym_->super_Scope,this,(Symbol *)thisSym_);
  (thisSym_->compilationUnits).data_ = (pointer)0x0;
  (thisSym_->compilationUnits).size_ = 0;
  (thisSym_->topInstances).data_ = (pointer)0x0;
  (thisSym_->topInstances).size_ = 0;
  pRVar2 = (this->root)._M_t.
           super___uniq_ptr_impl<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>
           ._M_t.
           super__Tuple_impl<0UL,_slang::ast::RootSymbol_*,_std::default_delete<slang::ast::RootSymbol>_>
           .super__Head_base<0UL,_slang::ast::RootSymbol_*,_false>._M_head_impl;
  (this->root)._M_t.
  super___uniq_ptr_impl<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>._M_t.
  super__Tuple_impl<0UL,_slang::ast::RootSymbol_*,_std::default_delete<slang::ast::RootSymbol>_>.
  super__Head_base<0UL,_slang::ast::RootSymbol_*,_false>._M_head_impl = thisSym_;
  if (pRVar2 != (RootSymbol *)0x0) {
    operator_delete(pRVar2,0x90);
  }
  builtins::registerArrayMethods(this);
  builtins::registerConversionFuncs(this);
  builtins::registerCoverageFuncs(this);
  builtins::registerEnumMethods(this);
  builtins::registerMathFuncs(this);
  builtins::registerMiscSystemFuncs(this);
  builtins::registerNonConstFuncs(this);
  builtins::registerQueryFuncs(this);
  builtins::registerStringMethods(this);
  builtins::registerSystemTasks(this);
  pPVar33 = builtins::createStdPackage(this);
  this->stdPkg = pPVar33;
  ska::detailv3::
  sherwood_v3_table<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PackageSymbol_const*>,std::basic_string_view<char,std::char_traits<char>>,slang::Hasher<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PackageSymbol_const*>,slang::Hasher<std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PackageSymbol_const*>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PackageSymbol_const*>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PackageSymbol_const*>>>>
  ::
  emplace<std::basic_string_view<char,std::char_traits<char>>const&,slang::ast::PackageSymbol_const*&>
            (local_d0,&(pPVar33->super_Symbol).name,&this->stdPkg);
  builtins::registerGateTypes(this);
  this_01 = (TypeArgFormatter *)operator_new(0x38);
  TypeArgFormatter::TypeArgFormatter(this_01);
  local_108[0]._M_head_impl = this_01;
  std::__shared_ptr<slang::DiagArgFormatter,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<slang::ast::TypeArgFormatter,std::default_delete<slang::ast::TypeArgFormatter>,void>
            ((__shared_ptr<slang::DiagArgFormatter,(__gnu_cxx::_Lock_policy)2> *)&local_40,
             (unique_ptr<slang::ast::TypeArgFormatter,_std::default_delete<slang::ast::TypeArgFormatter>_>
              *)local_108);
  DiagnosticEngine::setDefaultFormatter<slang::ast::Type_const*>(&local_40);
  if (local_40.super___shared_ptr<slang::DiagArgFormatter,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_40.super___shared_ptr<slang::DiagArgFormatter,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_108[0]._M_head_impl != (TypeArgFormatter *)0x0) {
    (*((local_108[0]._M_head_impl)->super_DiagArgFormatter)._vptr_DiagArgFormatter[1])();
  }
  uVar3 = TextDiagnosticClient::defaultSymbolPathCB_abi_cxx11_._16_8_;
  local_108[0]._M_head_impl =
       (TypeArgFormatter *)TextDiagnosticClient::defaultSymbolPathCB_abi_cxx11_._0_8_;
  local_108[1]._M_head_impl =
       (TypeArgFormatter *)TextDiagnosticClient::defaultSymbolPathCB_abi_cxx11_._8_8_;
  TextDiagnosticClient::defaultSymbolPathCB_abi_cxx11_._0_8_ = 0;
  TextDiagnosticClient::defaultSymbolPathCB_abi_cxx11_._8_8_ = 0;
  local_108[2]._M_head_impl =
       (TypeArgFormatter *)TextDiagnosticClient::defaultSymbolPathCB_abi_cxx11_._16_8_;
  TextDiagnosticClient::defaultSymbolPathCB_abi_cxx11_._16_8_ =
       std::
       _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_slang::ast::Symbol_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/Compilation.cpp:166:50)>
       ::_M_manager;
  local_108[3]._M_head_impl =
       (TypeArgFormatter *)TextDiagnosticClient::defaultSymbolPathCB_abi_cxx11_._24_8_;
  TextDiagnosticClient::defaultSymbolPathCB_abi_cxx11_._24_8_ =
       std::
       _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_slang::ast::Symbol_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/Compilation.cpp:166:50)>
       ::_M_invoke;
  if (uVar3 != 0) {
    (*(code *)uVar3)(local_108,local_108,3);
  }
  this->nextEnumSystemId = 1;
  this->nextStructSystemId = 1;
  this->nextUnionSystemId = 1;
  return;
}

Assistant:

Compilation::Compilation(const Bag& options) :
    options(options.getOrDefault<CompilationOptions>()), tempDiag({}, {}) {

    // Construct all built-in types.
    bitType = emplace<ScalarType>(ScalarType::Bit);
    logicType = emplace<ScalarType>(ScalarType::Logic);
    intType = emplace<PredefinedIntegerType>(PredefinedIntegerType::Int);
    byteType = emplace<PredefinedIntegerType>(PredefinedIntegerType::Byte);
    integerType = emplace<PredefinedIntegerType>(PredefinedIntegerType::Integer);
    realType = emplace<FloatingType>(FloatingType::Real);
    shortRealType = emplace<FloatingType>(FloatingType::ShortReal);
    stringType = emplace<StringType>();
    voidType = emplace<VoidType>();
    errorType = emplace<ErrorType>();

    auto regType = emplace<ScalarType>(ScalarType::Reg);
    auto signedBitType = emplace<ScalarType>(ScalarType::Bit, true);
    auto signedLogicType = emplace<ScalarType>(ScalarType::Logic, true);
    auto signedRegType = emplace<ScalarType>(ScalarType::Reg, true);
    auto shortIntType = emplace<PredefinedIntegerType>(PredefinedIntegerType::ShortInt);
    auto longIntType = emplace<PredefinedIntegerType>(PredefinedIntegerType::LongInt);
    auto timeType = emplace<PredefinedIntegerType>(PredefinedIntegerType::Time);
    auto realTimeType = emplace<FloatingType>(FloatingType::RealTime);
    auto chandleType = emplace<CHandleType>();
    auto nullType = emplace<NullType>();
    auto eventType = emplace<EventType>();
    auto unboundedType = emplace<UnboundedType>();
    auto typeRefType = emplace<TypeRefType>();
    auto untypedType = emplace<UntypedType>();
    auto sequenceType = emplace<SequenceType>();
    auto propertyType = emplace<PropertyType>();

    // Register built-in types for lookup by syntax kind.
    knownTypes[SyntaxKind::ShortIntType] = shortIntType;
    knownTypes[SyntaxKind::IntType] = intType;
    knownTypes[SyntaxKind::LongIntType] = longIntType;
    knownTypes[SyntaxKind::ByteType] = byteType;
    knownTypes[SyntaxKind::BitType] = bitType;
    knownTypes[SyntaxKind::LogicType] = logicType;
    knownTypes[SyntaxKind::RegType] = regType;
    knownTypes[SyntaxKind::IntegerType] = integerType;
    knownTypes[SyntaxKind::TimeType] = timeType;
    knownTypes[SyntaxKind::RealType] = realType;
    knownTypes[SyntaxKind::RealTimeType] = realTimeType;
    knownTypes[SyntaxKind::ShortRealType] = shortRealType;
    knownTypes[SyntaxKind::StringType] = stringType;
    knownTypes[SyntaxKind::CHandleType] = chandleType;
    knownTypes[SyntaxKind::NullLiteralExpression] = nullType;
    knownTypes[SyntaxKind::VoidType] = voidType;
    knownTypes[SyntaxKind::EventType] = eventType;
    knownTypes[SyntaxKind::WildcardLiteralExpression] = unboundedType;
    knownTypes[SyntaxKind::TypeReference] = typeRefType;
    knownTypes[SyntaxKind::Untyped] = untypedType;
    knownTypes[SyntaxKind::SequenceType] = sequenceType;
    knownTypes[SyntaxKind::PropertyType] = propertyType;
    knownTypes[SyntaxKind::Unknown] = errorType;

#define MAKE_NETTYPE(type)                                               \
    knownNetTypes[TokenKind::type##Keyword] = std::make_unique<NetType>( \
        NetType::type, LexerFacts::getTokenKindText(TokenKind::type##Keyword), *logicType)

    MAKE_NETTYPE(Wire);
    MAKE_NETTYPE(WAnd);
    MAKE_NETTYPE(WOr);
    MAKE_NETTYPE(Tri);
    MAKE_NETTYPE(TriAnd);
    MAKE_NETTYPE(TriOr);
    MAKE_NETTYPE(Tri0);
    MAKE_NETTYPE(Tri1);
    MAKE_NETTYPE(TriReg);
    MAKE_NETTYPE(Supply0);
    MAKE_NETTYPE(Supply1);
    MAKE_NETTYPE(UWire);
    MAKE_NETTYPE(Interconnect);

    knownNetTypes[TokenKind::Unknown] = std::make_unique<NetType>(NetType::Unknown, "<error>",
                                                                  *logicType);
    wireNetType = knownNetTypes[TokenKind::WireKeyword].get();

#undef MAKE_NETTYPE

    // Scalar types are indexed by bit flags.
    auto registerScalar = [this](auto type) {
        scalarTypeTable[type->getIntegralFlags().bits() & 0x7] = type;
    };
    registerScalar(bitType);
    registerScalar(logicType);
    registerScalar(regType);
    registerScalar(signedBitType);
    registerScalar(signedLogicType);
    registerScalar(signedRegType);

    defaultTimeScale.base = {TimeUnit::Nanoseconds, TimeScaleMagnitude::One};
    defaultTimeScale.precision = {TimeUnit::Nanoseconds, TimeScaleMagnitude::One};

    root = std::make_unique<RootSymbol>(*this);

    // Register all system tasks, functions, and methods.
    builtins::registerArrayMethods(*this);
    builtins::registerConversionFuncs(*this);
    builtins::registerCoverageFuncs(*this);
    builtins::registerEnumMethods(*this);
    builtins::registerMathFuncs(*this);
    builtins::registerMiscSystemFuncs(*this);
    builtins::registerNonConstFuncs(*this);
    builtins::registerQueryFuncs(*this);
    builtins::registerStringMethods(*this);
    builtins::registerSystemTasks(*this);

    // Register the built-in std package.
    stdPkg = &builtins::createStdPackage(*this);
    packageMap.emplace(stdPkg->name, stdPkg);

    // Register the built-in gate types.
    builtins::registerGateTypes(*this);

    // Set a default handler for printing types and symbol paths, for convenience.
    DiagnosticEngine::setDefaultFormatter<const Type*>(std::make_unique<TypeArgFormatter>());
    TextDiagnosticClient::setDefaultSymbolPathCB([](const Symbol& sym) {
        std::string str;
        sym.getHierarchicalPath(str);
        return str;
    });

    // Reset systemId counters that may have been changed due to creation of types
    // in the std package.
    nextEnumSystemId = 1;
    nextStructSystemId = 1;
    nextUnionSystemId = 1;
}